

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

void tinygltf::SerializeGltfModel(Model *model,json *o)

{
  pointer pAVar1;
  pointer value;
  pointer value_00;
  pointer value_01;
  pointer value_02;
  pointer value_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  double dVar4;
  value_t vVar5;
  pointer pAVar6;
  double *pdVar7;
  pointer pAVar8;
  pointer pcVar9;
  pointer pMVar10;
  pointer pPVar11;
  pointer pTVar12;
  pointer pSVar13;
  pointer pLVar14;
  pointer pAVar15;
  pointer pAVar16;
  pointer pNVar17;
  Model *pMVar18;
  pointer pdVar19;
  bool bVar20;
  int iVar21;
  ExtensionMap *pEVar22;
  pointer pAVar23;
  ulong uVar24;
  ulong uVar25;
  reference pbVar26;
  ulong uVar27;
  _Rb_tree_node_base *p_Var28;
  reference pbVar29;
  char *pcVar30;
  pointer pMVar31;
  pointer pNVar32;
  pointer pMVar33;
  ExtensionMap *pEVar34;
  pointer pNVar35;
  uint uVar36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  json_value jVar38;
  json_value jVar39;
  json_value jVar40;
  ulong uVar41;
  pointer value_04;
  pointer pMVar42;
  _Alloc_hider _Var43;
  pointer pMVar44;
  pointer pBVar45;
  pointer pSVar46;
  pointer pSVar47;
  long lVar48;
  double *pdVar49;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<int,_std::allocator<int>_> values;
  json sparse;
  json indices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionsUsed;
  json animation;
  json material;
  json asset;
  string type;
  json sources;
  json source;
  string local_368;
  undefined1 local_348 [24];
  primitive_iterator_t pStack_330;
  Model *local_320;
  string local_318;
  json *local_2f8;
  vector<double,_std::allocator<double>_> local_2f0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2d8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2c8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2b8;
  undefined1 local_2a8 [24];
  undefined1 auStack_290 [16];
  undefined1 local_280 [72];
  pointer local_238;
  pointer local_230;
  pointer local_228;
  size_t local_220;
  bool local_218;
  ExtensionMap EStack_1e8;
  Value local_1b8;
  ExtensionMap local_120 [3];
  ExtensionMap *local_68;
  pointer local_60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  ulong local_48;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  
  local_320 = model;
  local_2f8 = o;
  if ((model->accessors).super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (model->accessors).super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0;
    local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f0,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f0,true);
    if ((model->accessors).
        super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->accessors).
        super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>._M_impl.
        super__Vector_impl_data._M_start) {
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
      pEVar34 = (ExtensionMap *)0x0;
      do {
        local_2b8.m_type = null;
        local_2b8.m_value.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2b8,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2b8,true);
        pAVar6 = (model->accessors).
                 super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pAVar1 = pAVar6 + (long)pEVar34;
        if (-1 < pAVar6[(long)pEVar34].bufferView) {
          local_2a8[0x10] = 'b';
          local_2a8[0x11] = 'u';
          local_2a8[0x12] = 'f';
          local_2a8[0x13] = 'f';
          local_2a8[0x14] = 'e';
          local_2a8[0x15] = 'r';
          local_2a8[0x16] = 'V';
          local_2a8[0x17] = 'i';
          auStack_290[0] = 'e';
          auStack_290[1] = 'w';
          local_2a8._8_8_ = (pointer)0xa;
          auStack_290[2] = '\0';
          local_2a8._0_8_ = paVar2;
          SerializeNumberProperty<int>((string *)local_2a8,pAVar1->bufferView,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ != paVar2) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (pAVar1->byteOffset != 0) {
          local_2a8[0x10] = 'b';
          local_2a8[0x11] = 'y';
          local_2a8[0x12] = 't';
          local_2a8[0x13] = 'e';
          local_2a8[0x14] = 'O';
          local_2a8[0x15] = 'f';
          local_2a8[0x16] = 'f';
          local_2a8[0x17] = 's';
          auStack_290[0] = 'e';
          auStack_290[1] = 't';
          local_2a8._8_8_ = (pointer)0xa;
          auStack_290[2] = '\0';
          local_2a8._0_8_ = paVar2;
          SerializeNumberProperty<unsigned_long>((string *)local_2a8,pAVar1->byteOffset,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ != paVar2) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        auStack_290[0] = 't';
        auStack_290[1] = 'T';
        auStack_290[2] = 'y';
        auStack_290[3] = 'p';
        auStack_290[4] = 'e';
        local_2a8[0x10] = 'c';
        local_2a8[0x11] = 'o';
        local_2a8[0x12] = 'm';
        local_2a8[0x13] = 'p';
        local_2a8[0x14] = 'o';
        local_2a8[0x15] = 'n';
        local_2a8[0x16] = 'e';
        local_2a8[0x17] = 'n';
        local_2a8._8_8_ = (pointer)0xd;
        auStack_290[5] = '\0';
        local_2a8._0_8_ = paVar2;
        SerializeNumberProperty<int>((string *)local_2a8,pAVar1->componentType,&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ != paVar2) {
          operator_delete((void *)local_2a8._0_8_);
        }
        local_2a8[0x14] = 't';
        local_2a8[0x10] = 'c';
        local_2a8[0x11] = 'o';
        local_2a8[0x12] = 'u';
        local_2a8[0x13] = 'n';
        local_2a8._8_8_ = (pointer)0x5;
        local_2a8[0x15] = '\0';
        local_2a8._0_8_ = paVar2;
        SerializeNumberProperty<unsigned_long>((string *)local_2a8,pAVar1->count,&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ != paVar2) {
          operator_delete((void *)local_2a8._0_8_);
        }
        if ((pAVar1->componentType == 0x140a) || (pAVar1->componentType == 0x1406)) {
          local_2a8[0x12] = 'n';
          local_2a8[0x10] = 'm';
          local_2a8[0x11] = 'i';
          local_2a8._8_8_ = (pointer)0x3;
          local_2a8[0x13] = '\0';
          local_2a8._0_8_ = paVar2;
          SerializeNumberArrayProperty<double>((string *)local_2a8,&pAVar1->minValues,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ != paVar2) {
            operator_delete((void *)local_2a8._0_8_);
          }
          local_2a8[0x12] = 'x';
          local_2a8[0x10] = 'm';
          local_2a8[0x11] = 'a';
          local_2a8._8_8_ = (pointer)0x3;
          local_2a8[0x13] = '\0';
          local_2a8._0_8_ = paVar2;
          SerializeNumberArrayProperty<double>((string *)local_2a8,&pAVar1->maxValues,&local_2b8);
          _Var43._M_p = (pointer)local_2a8._0_8_;
          model = local_320;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ != paVar2) goto LAB_0011e235;
        }
        else {
          local_368._M_dataplus._M_p = (pointer)0x0;
          local_368._M_string_length = 0;
          local_368.field_2._M_local_buf[0] = '\0';
          local_368.field_2._M_local_buf[1] = '\0';
          local_368.field_2._M_local_buf[2] = '\0';
          local_368.field_2._M_local_buf[3] = '\0';
          local_368.field_2._M_local_buf[4] = '\0';
          local_368.field_2._M_local_buf[5] = '\0';
          local_368.field_2._M_local_buf[6] = '\0';
          local_368.field_2._M_local_buf[7] = '\0';
          pdVar7 = *(pointer *)
                    ((long)&(pAVar1->minValues).super__Vector_base<double,_std::allocator<double>_>
                    + 8);
          for (pdVar49 = *(double **)
                          &(pAVar1->minValues).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl; pdVar49 != pdVar7; pdVar49 = pdVar49 + 1) {
            local_2a8._0_4_ = (int)*pdVar49;
            if ((int *)local_368._M_string_length ==
                (int *)CONCAT17(local_368.field_2._M_local_buf[7],
                                CONCAT16(local_368.field_2._M_local_buf[6],
                                         CONCAT15(local_368.field_2._M_local_buf[5],
                                                  CONCAT14(local_368.field_2._M_local_buf[4],
                                                           CONCAT13(local_368.field_2._M_local_buf
                                                                    [3],CONCAT12(local_368.field_2.
                                                                                 _M_local_buf[2],
                                                                                 CONCAT11(local_368.
                                                                                          field_2.
                                                  _M_local_buf[1],local_368.field_2._M_local_buf[0])
                                                  ))))))) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&local_368,
                         (iterator)local_368._M_string_length,(int *)local_2a8);
            }
            else {
              *(int *)local_368._M_string_length = (int)*pdVar49;
              local_368._M_string_length = local_368._M_string_length + 4;
            }
          }
          local_2a8[0x12] = 'n';
          local_2a8[0x10] = 'm';
          local_2a8[0x11] = 'i';
          local_2a8._8_8_ = (pointer)0x3;
          local_2a8[0x13] = '\0';
          local_2a8._0_8_ = paVar2;
          SerializeNumberArrayProperty<int>
                    ((string *)local_2a8,(vector<int,_std::allocator<int>_> *)&local_368,&local_2b8)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ != paVar2) {
            operator_delete((void *)local_2a8._0_8_);
          }
          if (local_368._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          local_368._M_dataplus._M_p = (pointer)0x0;
          local_368._M_string_length = 0;
          local_368.field_2._M_local_buf[0] = '\0';
          local_368.field_2._M_local_buf[1] = '\0';
          local_368.field_2._M_local_buf[2] = '\0';
          local_368.field_2._M_local_buf[3] = '\0';
          local_368.field_2._M_local_buf[4] = '\0';
          local_368.field_2._M_local_buf[5] = '\0';
          local_368.field_2._M_local_buf[6] = '\0';
          local_368.field_2._M_local_buf[7] = '\0';
          pdVar7 = *(pointer *)
                    ((long)&(pAVar1->maxValues).super__Vector_base<double,_std::allocator<double>_>
                    + 8);
          for (pdVar49 = *(double **)
                          &(pAVar1->maxValues).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl; pdVar49 != pdVar7; pdVar49 = pdVar49 + 1) {
            local_2a8._0_4_ = (int)*pdVar49;
            if ((int *)local_368._M_string_length ==
                (int *)CONCAT17(local_368.field_2._M_local_buf[7],
                                CONCAT16(local_368.field_2._M_local_buf[6],
                                         CONCAT15(local_368.field_2._M_local_buf[5],
                                                  CONCAT14(local_368.field_2._M_local_buf[4],
                                                           CONCAT13(local_368.field_2._M_local_buf
                                                                    [3],CONCAT12(local_368.field_2.
                                                                                 _M_local_buf[2],
                                                                                 CONCAT11(local_368.
                                                                                          field_2.
                                                  _M_local_buf[1],local_368.field_2._M_local_buf[0])
                                                  ))))))) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&local_368,
                         (iterator)local_368._M_string_length,(int *)local_2a8);
            }
            else {
              *(int *)local_368._M_string_length = (int)*pdVar49;
              local_368._M_string_length = local_368._M_string_length + 4;
            }
          }
          local_2a8[0x12] = 'x';
          local_2a8[0x10] = 'm';
          local_2a8[0x11] = 'a';
          local_2a8._8_8_ = (pointer)0x3;
          local_2a8[0x13] = '\0';
          local_2a8._0_8_ = paVar2;
          SerializeNumberArrayProperty<int>
                    ((string *)local_2a8,(vector<int,_std::allocator<int>_> *)&local_368,&local_2b8)
          ;
          model = local_320;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ != paVar2) {
            operator_delete((void *)local_2a8._0_8_);
          }
          _Var43._M_p = local_368._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
LAB_0011e235:
            operator_delete(_Var43._M_p);
          }
        }
        if (pAVar1->normalized == true) {
          local_368.field_2._M_local_buf[0] = 'n';
          local_368.field_2._M_local_buf[1] = 'o';
          local_368.field_2._M_local_buf[2] = 'r';
          local_368.field_2._M_local_buf[3] = 'm';
          local_368.field_2._M_local_buf[4] = 'a';
          local_368.field_2._M_local_buf[5] = 'l';
          local_368.field_2._M_local_buf[6] = 'i';
          local_368.field_2._M_local_buf[7] = 'z';
          local_368.field_2._M_local_buf[8] = 'e';
          local_368.field_2._M_local_buf[9] = 'd';
          local_368._M_string_length = 10;
          local_368.field_2._M_local_buf[10] = '\0';
          local_218 = pAVar1->normalized;
          local_2a8._0_8_ = (pointer)0x3;
          local_2a8._8_8_ = (object_t *)0x0;
          puVar3 = auStack_290 + 8;
          local_2a8[0x10] = SUB81(puVar3,0);
          local_2a8[0x11] = (undefined1)((ulong)puVar3 >> 8);
          local_2a8[0x12] = (undefined1)((ulong)puVar3 >> 0x10);
          local_2a8[0x13] = (undefined1)((ulong)puVar3 >> 0x18);
          local_2a8[0x14] = (undefined1)((ulong)puVar3 >> 0x20);
          local_2a8[0x15] = (undefined1)((ulong)puVar3 >> 0x28);
          local_2a8[0x16] = (undefined1)((ulong)puVar3 >> 0x30);
          local_2a8[0x17] = (undefined1)((ulong)puVar3 >> 0x38);
          auStack_290[0] = '\0';
          auStack_290[1] = '\0';
          auStack_290[2] = '\0';
          auStack_290[3] = '\0';
          auStack_290[4] = '\0';
          auStack_290[5] = '\0';
          auStack_290[6] = '\0';
          auStack_290[7] = '\0';
          auStack_290[8] = '\0';
          local_280._64_4_ = _S_red;
          local_238 = (pointer)0x0;
          local_280._40_8_ = (pointer)0x0;
          local_280._48_8_ = (pointer)0x0;
          local_280._24_8_ = (pointer)0x0;
          local_280._32_8_ = (pointer)0x0;
          local_280._8_8_ = (pointer)0x0;
          local_280._16_8_ = (pointer)0x0;
          local_230 = (pointer)(local_280 + 0x40);
          local_220 = 0;
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          local_228 = local_230;
          SerializeValue(&local_368,(Value *)local_2a8,&local_2b8);
          Value::~Value((Value *)local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
        }
        paVar37 = &local_368.field_2;
        local_2a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_2a8[0x10] = '\0';
        iVar21 = pAVar1->type;
        if (iVar21 < 0x22) {
          if (iVar21 == 2) {
            pcVar30 = "VEC2";
          }
          else if (iVar21 == 3) {
            pcVar30 = "VEC3";
          }
          else {
            local_2a8._0_8_ = paVar2;
            if (iVar21 != 4) goto LAB_0011e58b;
            pcVar30 = "VEC4";
          }
LAB_0011e57a:
          local_2a8._0_8_ = paVar2;
          std::__cxx11::string::_M_replace((ulong)local_2a8,0,(char *)0x0,(ulong)pcVar30);
        }
        else {
          if (0x23 < iVar21) {
            if (iVar21 == 0x24) {
              pcVar30 = "MAT4";
            }
            else {
              local_2a8._0_8_ = paVar2;
              if (iVar21 != 0x41) goto LAB_0011e58b;
              pcVar30 = "SCALAR";
            }
            goto LAB_0011e57a;
          }
          if (iVar21 == 0x22) {
            pcVar30 = "MAT2";
            goto LAB_0011e57a;
          }
          local_2a8._0_8_ = paVar2;
          if (iVar21 == 0x23) {
            pcVar30 = "MAT3";
            goto LAB_0011e57a;
          }
        }
LAB_0011e58b:
        local_368.field_2._M_local_buf[0] = 't';
        local_368.field_2._M_local_buf[1] = 'y';
        local_368.field_2._M_local_buf[2] = 'p';
        local_368.field_2._M_local_buf[3] = 'e';
        local_368._M_string_length = 4;
        local_368.field_2._M_local_buf[4] = '\0';
        local_368._M_dataplus._M_p = (pointer)paVar37;
        SerializeStringProperty(&local_368,(string *)local_2a8,&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != paVar37) {
          operator_delete(local_368._M_dataplus._M_p);
        }
        if ((pAVar1->name)._M_string_length != 0) {
          local_368.field_2._M_local_buf[0] = 'n';
          local_368.field_2._M_local_buf[1] = 'a';
          local_368.field_2._M_local_buf[2] = 'm';
          local_368.field_2._M_local_buf[3] = 'e';
          local_368._M_string_length = 4;
          local_368.field_2._M_local_buf[4] = '\0';
          local_368._M_dataplus._M_p = (pointer)paVar37;
          SerializeStringProperty(&local_368,&pAVar1->name,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != paVar37) {
            operator_delete(local_368._M_dataplus._M_p);
          }
        }
        SerializeExtensionMap(&pAVar1->extensions,&local_2b8);
        SerializeExtras(&pAVar1->extras,&local_2b8);
        if ((pAVar1->sparse).isSparse == true) {
          local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
          local_348._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_68 = pEVar34;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_348,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_348,true);
          local_368.field_2._M_local_buf[4] = 't';
          local_368.field_2._M_local_buf[0] = 'c';
          local_368.field_2._M_local_buf[1] = 'o';
          local_368.field_2._M_local_buf[2] = 'u';
          local_368.field_2._M_local_buf[3] = 'n';
          local_368._M_string_length = 5;
          local_368.field_2._M_local_buf[5] = '\0';
          local_368._M_dataplus._M_p = (pointer)paVar37;
          SerializeNumberProperty<int>
                    (&local_368,(pAVar1->sparse).count,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != paVar37) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          local_318._M_dataplus._M_p = local_318._M_dataplus._M_p & 0xffffffffffffff00;
          local_318._M_string_length = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_318,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_318,true);
          paVar37 = &local_368.field_2;
          local_368.field_2._M_local_buf[0] = 'b';
          local_368.field_2._M_local_buf[1] = 'u';
          local_368.field_2._M_local_buf[2] = 'f';
          local_368.field_2._M_local_buf[3] = 'f';
          local_368.field_2._M_local_buf[4] = 'e';
          local_368.field_2._M_local_buf[5] = 'r';
          local_368.field_2._M_local_buf[6] = 'V';
          local_368.field_2._M_local_buf[7] = 'i';
          local_368.field_2._M_local_buf[8] = 'e';
          local_368.field_2._M_local_buf[9] = 'w';
          local_368._M_string_length = 10;
          local_368.field_2._M_local_buf[10] = '\0';
          local_368._M_dataplus._M_p = (pointer)paVar37;
          SerializeNumberProperty<int>
                    (&local_368,*(int *)((long)&(pAVar1->sparse).indices + 8),(json *)&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != paVar37) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          local_368.field_2._M_local_buf[0] = 'b';
          local_368.field_2._M_local_buf[1] = 'y';
          local_368.field_2._M_local_buf[2] = 't';
          local_368.field_2._M_local_buf[3] = 'e';
          local_368.field_2._M_local_buf[4] = 'O';
          local_368.field_2._M_local_buf[5] = 'f';
          local_368.field_2._M_local_buf[6] = 'f';
          local_368.field_2._M_local_buf[7] = 's';
          local_368.field_2._M_local_buf[8] = 'e';
          local_368.field_2._M_local_buf[9] = 't';
          local_368._M_string_length = 10;
          local_368.field_2._M_local_buf[10] = '\0';
          local_368._M_dataplus._M_p = (pointer)paVar37;
          SerializeNumberProperty<unsigned_long>
                    (&local_368,(pAVar1->sparse).indices.byteOffset,(json *)&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != paVar37) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          local_368.field_2._M_local_buf[8] = 't';
          local_368.field_2._M_local_buf[9] = 'T';
          local_368.field_2._M_local_buf[10] = 'y';
          local_368.field_2._11_2_ = 0x6570;
          local_368.field_2._M_local_buf[0] = 'c';
          local_368.field_2._M_local_buf[1] = 'o';
          local_368.field_2._M_local_buf[2] = 'm';
          local_368.field_2._M_local_buf[3] = 'p';
          local_368.field_2._M_local_buf[4] = 'o';
          local_368.field_2._M_local_buf[5] = 'n';
          local_368.field_2._M_local_buf[6] = 'e';
          local_368.field_2._M_local_buf[7] = 'n';
          local_368._M_string_length = 0xd;
          local_368.field_2._M_local_buf[0xd] = '\0';
          local_368._M_dataplus._M_p = (pointer)paVar37;
          SerializeNumberProperty<int>
                    (&local_368,*(int *)((long)&(pAVar1->sparse).indices + 0xc),(json *)&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != paVar37) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          SerializeExtensionMap
                    ((ExtensionMap *)((long)&(pAVar1->sparse).indices + 0xa8),(json *)&local_318);
          SerializeExtras((Value *)((long)&(pAVar1->sparse).indices + 0x10),(json *)&local_318);
          detail::JsonAddMember((json *)local_348,"indices",(json *)&local_318);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_318);
          local_318._M_dataplus._M_p = local_318._M_dataplus._M_p & 0xffffffffffffff00;
          local_318._M_string_length = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_318,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_318,true);
          local_368.field_2._M_local_buf[0] = 'b';
          local_368.field_2._M_local_buf[1] = 'u';
          local_368.field_2._M_local_buf[2] = 'f';
          local_368.field_2._M_local_buf[3] = 'f';
          local_368.field_2._M_local_buf[4] = 'e';
          local_368.field_2._M_local_buf[5] = 'r';
          local_368.field_2._M_local_buf[6] = 'V';
          local_368.field_2._M_local_buf[7] = 'i';
          local_368.field_2._M_local_buf[8] = 'e';
          local_368.field_2._M_local_buf[9] = 'w';
          local_368._M_string_length = 10;
          local_368.field_2._M_local_buf[10] = '\0';
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          SerializeNumberProperty<int>
                    (&local_368,(pAVar1->sparse).values.bufferView,(json *)&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          local_368.field_2._M_local_buf[0] = 'b';
          local_368.field_2._M_local_buf[1] = 'y';
          local_368.field_2._M_local_buf[2] = 't';
          local_368.field_2._M_local_buf[3] = 'e';
          local_368.field_2._M_local_buf[4] = 'O';
          local_368.field_2._M_local_buf[5] = 'f';
          local_368.field_2._M_local_buf[6] = 'f';
          local_368.field_2._M_local_buf[7] = 's';
          local_368.field_2._M_local_buf[8] = 'e';
          local_368.field_2._M_local_buf[9] = 't';
          local_368._M_string_length = 10;
          local_368.field_2._M_local_buf[10] = '\0';
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          SerializeNumberProperty<unsigned_long>
                    (&local_368,*(size_t *)((long)&(pAVar1->sparse).values + 8),(json *)&local_318);
          model = local_320;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          SerializeExtensionMap
                    ((ExtensionMap *)((long)&(pAVar1->sparse).values + 0xa8),(json *)&local_318);
          SerializeExtras((Value *)((long)&(pAVar1->sparse).values + 0x10),(json *)&local_318);
          detail::JsonAddMember((json *)local_348,"values",(json *)&local_318);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_318);
          SerializeExtensionMap(&(pAVar1->sparse).extensions,(json *)local_348);
          SerializeExtras(&(pAVar1->sparse).extras,(json *)local_348);
          detail::JsonAddMember(&local_2b8,"sparse",(json *)local_348);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((json *)local_348);
          pEVar34 = local_68;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ != paVar2) {
          operator_delete((void *)local_2a8._0_8_);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_2f0,&local_2b8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_2b8);
        pEVar34 = (ExtensionMap *)(ulong)((int)pEVar34 + 1);
        pEVar22 = (ExtensionMap *)
                  (((long)(model->accessors).
                          super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(model->accessors).
                          super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6) * -0x79435e50d79435e5);
      } while (pEVar34 <= pEVar22 && (long)pEVar22 - (long)pEVar34 != 0);
    }
    detail::JsonAddMember(local_2f8,"accessors",(json *)&local_2f0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_2f0);
  }
  if ((model->animations).
      super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->animations).
      super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2b8.m_type = null;
    local_2b8.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2b8,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2b8,true);
    pAVar23 = (model->animations).
              super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((model->animations).
        super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
        super__Vector_impl_data._M_finish != pAVar23) {
      paVar2 = &local_368.field_2;
      local_68 = &EStack_1e8;
      pMVar33 = (pointer)0x0;
      do {
        if (pAVar23[(long)pMVar33].channels.
            super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            pAVar23[(long)pMVar33].channels.
            super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_2d8.m_type = null;
          local_2d8.m_value.object = (object_t *)0x0;
          local_60 = pMVar33;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant(&local_2d8,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant(&local_2d8,true);
          pAVar8 = (model->animations).
                   super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pAVar23 = pAVar8 + (long)pMVar33;
          if (pAVar8[(long)pMVar33].name._M_string_length != 0) {
            local_2a8[0x10] = 'n';
            local_2a8[0x11] = 'a';
            local_2a8[0x12] = 'm';
            local_2a8[0x13] = 'e';
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x4;
            local_2a8[0x14] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeStringProperty((string *)local_2a8,&pAVar23->name,&local_2d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
          }
          local_318._M_dataplus._M_p = local_318._M_dataplus._M_p & 0xffffffffffffff00;
          local_318._M_string_length = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_318,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_318,true);
          if (*(pointer *)
               ((long)&(pAVar23->channels).
                       super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                       ._M_impl + 8) !=
              (pAVar23->channels).
              super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar36 = 1;
            uVar27 = 0;
            do {
              local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start._0_1_ =
                   (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0;
              local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_2f0,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_2f0,true);
              AnimationChannel::AnimationChannel
                        ((AnimationChannel *)local_2a8,
                         (AnimationChannel *)
                         ((long)(pAVar23->channels).
                                super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar27 * 0x238));
              local_368.field_2._M_local_buf[4] = 'l';
              local_368.field_2._M_local_buf[5] = 'e';
              local_368.field_2._M_local_buf[6] = 'r';
              local_368.field_2._M_local_buf[0] = 's';
              local_368.field_2._M_local_buf[1] = 'a';
              local_368.field_2._M_local_buf[2] = 'm';
              local_368.field_2._M_local_buf[3] = 'p';
              local_368._M_string_length = 7;
              local_368.field_2._M_local_buf[7] = '\0';
              local_368._M_dataplus._M_p = (pointer)paVar2;
              SerializeNumberProperty<int>
                        (&local_368,local_2a8._0_4_,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&local_2f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_dataplus._M_p != paVar2) {
                operator_delete(local_368._M_dataplus._M_p);
              }
              local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
              local_348._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)local_348,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)local_348,true);
              if (-1 < (long)local_2a8._0_8_) {
                local_368.field_2._M_local_buf[0] = 'n';
                local_368.field_2._M_local_buf[1] = 'o';
                local_368.field_2._M_local_buf[2] = 'd';
                local_368.field_2._M_local_buf[3] = 'e';
                local_368._M_string_length = 4;
                local_368.field_2._M_local_buf[4] = '\0';
                local_368._M_dataplus._M_p = (pointer)paVar2;
                SerializeNumberProperty<int>
                          (&local_368,local_2a8._4_4_,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p != paVar2) {
                  operator_delete(local_368._M_dataplus._M_p);
                }
              }
              local_368.field_2._M_local_buf[0] = 'p';
              local_368.field_2._M_local_buf[1] = 'a';
              local_368.field_2._M_local_buf[2] = 't';
              local_368.field_2._M_local_buf[3] = 'h';
              local_368._M_string_length = 4;
              local_368.field_2._M_local_buf[4] = '\0';
              local_368._M_dataplus._M_p = (pointer)paVar2;
              SerializeStringProperty
                        (&local_368,(string *)(local_2a8 + 8),
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_348);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_dataplus._M_p != paVar2) {
                operator_delete(local_368._M_dataplus._M_p);
              }
              SerializeExtensionMap
                        (local_120,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_348);
              SerializeExtras(&local_1b8,
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)local_348);
              detail::JsonAddMember
                        ((json *)&local_2f0,"target",
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_348);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)local_348);
              SerializeExtensionMap
                        (local_68,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)&local_2f0);
              SerializeExtras((Value *)local_280,
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_2f0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_318,
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_2f0);
              AnimationChannel::~AnimationChannel((AnimationChannel *)local_2a8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&local_2f0);
              uVar27 = (ulong)uVar36;
              uVar24 = ((long)*(pointer *)
                               ((long)&(pAVar23->channels).
                                       super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                                       ._M_impl + 8) -
                        (long)(pAVar23->channels).
                              super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x193d4bb7e327a977;
              uVar36 = uVar36 + 1;
            } while (uVar27 <= uVar24 && uVar24 - uVar27 != 0);
          }
          detail::JsonAddMember(&local_2d8,"channels",(json *)&local_318);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_318);
          local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
          local_348._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_348,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_348,true);
          if (*(pointer *)
               ((long)&(pAVar23->samplers).
                       super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                       ._M_impl + 8) !=
              *(pointer *)
               &(pAVar23->samplers).
                super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                ._M_impl) {
            uVar36 = 1;
            uVar27 = 0;
            do {
              local_318._M_dataplus._M_p = local_318._M_dataplus._M_p & 0xffffffffffffff00;
              local_318._M_string_length = 0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_318,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_318,true);
              AnimationSampler::AnimationSampler
                        ((AnimationSampler *)local_2a8,
                         (AnimationSampler *)
                         (uVar27 * 0x130 +
                         *(long *)&(pAVar23->samplers).
                                   super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                                   ._M_impl));
              local_368.field_2._M_local_buf[4] = 't';
              local_368.field_2._M_local_buf[0] = 'i';
              local_368.field_2._M_local_buf[1] = 'n';
              local_368.field_2._M_local_buf[2] = 'p';
              local_368.field_2._M_local_buf[3] = 'u';
              local_368._M_string_length = 5;
              local_368.field_2._M_local_buf[5] = '\0';
              local_368._M_dataplus._M_p = (pointer)paVar2;
              SerializeNumberProperty<int>(&local_368,local_2a8._0_4_,(json *)&local_318);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_dataplus._M_p != paVar2) {
                operator_delete(local_368._M_dataplus._M_p);
              }
              local_368.field_2._M_local_buf[4] = 'u';
              local_368.field_2._M_local_buf[5] = 't';
              local_368.field_2._M_local_buf[0] = 'o';
              local_368.field_2._M_local_buf[1] = 'u';
              local_368.field_2._M_local_buf[2] = 't';
              local_368.field_2._M_local_buf[3] = 'p';
              local_368._M_string_length = 6;
              local_368.field_2._M_local_buf[6] = '\0';
              local_368._M_dataplus._M_p = (pointer)paVar2;
              SerializeNumberProperty<int>(&local_368,local_2a8._4_4_,(json *)&local_318);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_dataplus._M_p != paVar2) {
                operator_delete(local_368._M_dataplus._M_p);
              }
              local_368.field_2._M_local_buf[8] = 'a';
              local_368.field_2._M_local_buf[9] = 't';
              local_368.field_2._M_local_buf[10] = 'i';
              local_368.field_2._11_2_ = 0x6e6f;
              local_368.field_2._M_local_buf[0] = 'i';
              local_368.field_2._M_local_buf[1] = 'n';
              local_368.field_2._M_local_buf[2] = 't';
              local_368.field_2._M_local_buf[3] = 'e';
              local_368.field_2._M_local_buf[4] = 'r';
              local_368.field_2._M_local_buf[5] = 'p';
              local_368.field_2._M_local_buf[6] = 'o';
              local_368.field_2._M_local_buf[7] = 'l';
              local_368._M_string_length = 0xd;
              local_368.field_2._M_local_buf[0xd] = '\0';
              local_368._M_dataplus._M_p = (pointer)paVar2;
              SerializeStringProperty(&local_368,(string *)(local_2a8 + 8),(json *)&local_318);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_dataplus._M_p != paVar2) {
                operator_delete(local_368._M_dataplus._M_p);
              }
              SerializeExtensionMap(local_68,(json *)&local_318);
              SerializeExtras((Value *)local_280,(json *)&local_318);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_348,
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_318);
              AnimationSampler::~AnimationSampler((AnimationSampler *)local_2a8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&local_318);
              uVar27 = (ulong)uVar36;
              uVar24 = ((long)*(pointer *)
                               ((long)&(pAVar23->samplers).
                                       super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                                       ._M_impl + 8) -
                        *(long *)&(pAVar23->samplers).
                                  super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                                  ._M_impl >> 4) * -0x79435e50d79435e5;
              uVar36 = uVar36 + 1;
            } while (uVar27 <= uVar24 && uVar24 - uVar27 != 0);
          }
          detail::JsonAddMember
                    (&local_2d8,"samplers",
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          model = local_320;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
          SerializeExtensionMap(&pAVar23->extensions,&local_2d8);
          SerializeExtras(&pAVar23->extras,&local_2d8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::push_back(&local_2b8,&local_2d8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_2d8);
          pMVar33 = local_60;
        }
        pMVar33 = (pointer)(ulong)((int)pMVar33 + 1);
        pAVar23 = (model->animations).
                  super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar31 = (pointer)(((long)(model->animations).
                                   super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar23 >> 3)
                           * -0x7d05f417d05f417d);
      } while (pMVar33 <= pMVar31 && (long)pMVar31 - (long)pMVar33 != 0);
    }
    detail::JsonAddMember(local_2f8,"animations",&local_2b8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_2b8);
  }
  local_2b8.m_type = null;
  local_2b8.m_value.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_2b8,true);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_2b8,true);
  if ((model->asset).generator._M_string_length != 0) {
    local_2a8[0x10] = 'g';
    local_2a8[0x11] = 'e';
    local_2a8[0x12] = 'n';
    local_2a8[0x13] = 'e';
    local_2a8[0x14] = 'r';
    local_2a8[0x15] = 'a';
    local_2a8[0x16] = 't';
    local_2a8[0x17] = 'o';
    auStack_290[0] = 'r';
    auStack_290[1] = '\0';
    local_2a8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x9;
    local_2a8._0_8_ = local_2a8 + 0x10;
    SerializeStringProperty((string *)local_2a8,&(model->asset).generator,&local_2b8);
    if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
      operator_delete((void *)local_2a8._0_8_);
    }
  }
  if ((model->asset).copyright._M_string_length != 0) {
    local_2a8[0x10] = 'c';
    local_2a8[0x11] = 'o';
    local_2a8[0x12] = 'p';
    local_2a8[0x13] = 'y';
    local_2a8[0x14] = 'r';
    local_2a8[0x15] = 'i';
    local_2a8[0x16] = 'g';
    local_2a8[0x17] = 'h';
    auStack_290[0] = 't';
    auStack_290[1] = '\0';
    local_2a8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x9;
    local_2a8._0_8_ = local_2a8 + 0x10;
    SerializeStringProperty((string *)local_2a8,&(model->asset).copyright,&local_2b8);
    if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
      operator_delete((void *)local_2a8._0_8_);
    }
  }
  pcVar9 = (model->asset).version._M_dataplus._M_p;
  local_2a8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_2a8 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a8,pcVar9,pcVar9 + (model->asset).version._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._8_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::__cxx11::string::_M_replace((ulong)local_2a8,0,(char *)0x0,0x161f53);
  }
  local_368.field_2._M_local_buf[0] = 'v';
  local_368.field_2._M_local_buf[1] = 'e';
  local_368.field_2._M_local_buf[2] = 'r';
  local_368.field_2._M_local_buf[3] = 's';
  local_368.field_2._M_local_buf[4] = 'i';
  local_368.field_2._M_local_buf[5] = 'o';
  local_368.field_2._M_local_buf[6] = 'n';
  local_368._M_string_length = 7;
  local_368.field_2._M_local_buf[7] = '\0';
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  SerializeStringProperty(&local_368,(string *)local_2a8,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  SerializeExtensionMap(&(model->asset).extensions,&local_2b8);
  SerializeExtras(&(model->asset).extras,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_);
  }
  detail::JsonAddMember(local_2f8,"asset",&local_2b8);
  if ((model->bufferViews).
      super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->bufferViews).
      super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
    local_368._M_string_length = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    if ((model->bufferViews).
        super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->bufferViews).
        super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar27 = 1;
      uVar24 = 0;
      do {
        uVar41 = uVar27;
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        pBVar45 = (model->bufferViews).
                  super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_2a8[0x14] = 'e';
        local_2a8[0x15] = 'r';
        local_2a8[0x10] = 'b';
        local_2a8[0x11] = 'u';
        local_2a8[0x12] = 'f';
        local_2a8[0x13] = 'f';
        local_2a8._8_8_ = (pointer)0x6;
        local_2a8[0x16] = '\0';
        local_2a8._0_8_ = local_2a8 + 0x10;
        SerializeNumberProperty<int>
                  ((string *)local_2a8,pBVar45[uVar24].buffer,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_);
        }
        pBVar45 = pBVar45 + uVar24;
        local_2a8[0x10] = 'b';
        local_2a8[0x11] = 'y';
        local_2a8[0x12] = 't';
        local_2a8[0x13] = 'e';
        local_2a8[0x14] = 'L';
        local_2a8[0x15] = 'e';
        local_2a8[0x16] = 'n';
        local_2a8[0x17] = 'g';
        auStack_290[0] = 't';
        auStack_290[1] = 'h';
        local_2a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xa;
        auStack_290[2] = '\0';
        local_2a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_2a8 + 0x10);
        SerializeNumberProperty<unsigned_long>
                  ((string *)local_2a8,pBVar45->byteLength,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_);
        }
        if (3 < pBVar45->byteStride) {
          local_2a8[0x10] = 'b';
          local_2a8[0x11] = 'y';
          local_2a8[0x12] = 't';
          local_2a8[0x13] = 'e';
          local_2a8[0x14] = 'S';
          local_2a8[0x15] = 't';
          local_2a8[0x16] = 'r';
          local_2a8[0x17] = 'i';
          auStack_290[0] = 'd';
          auStack_290[1] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xa;
          auStack_290[2] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<unsigned_long>
                    ((string *)local_2a8,pBVar45->byteStride,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (pBVar45->byteOffset != 0) {
          local_2a8[0x10] = 'b';
          local_2a8[0x11] = 'y';
          local_2a8[0x12] = 't';
          local_2a8[0x13] = 'e';
          local_2a8[0x14] = 'O';
          local_2a8[0x15] = 'f';
          local_2a8[0x16] = 'f';
          local_2a8[0x17] = 's';
          auStack_290[0] = 'e';
          auStack_290[1] = 't';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xa;
          auStack_290[2] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<unsigned_long>
                    ((string *)local_2a8,pBVar45->byteOffset,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if ((pBVar45->target & 0xfffffffeU) == 0x8892) {
          local_2a8[0x14] = 'e';
          local_2a8[0x15] = 't';
          local_2a8[0x10] = 't';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'r';
          local_2a8[0x13] = 'g';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x6;
          local_2a8[0x16] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<int>
                    ((string *)local_2a8,pBVar45->target,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if ((pBVar45->name)._M_string_length != 0) {
          local_2a8[0x10] = 'n';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeStringProperty
                    ((string *)local_2a8,&pBVar45->name,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        SerializeExtensionMap
                  (&pBVar45->extensions,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        SerializeExtras(&pBVar45->extras,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_368,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        uVar25 = ((long)(local_320->bufferViews).
                        super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_320->bufferViews).
                        super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d;
        uVar27 = (ulong)((int)uVar41 + 1);
        model = local_320;
        uVar24 = uVar41;
      } while (uVar41 <= uVar25 && uVar25 - uVar41 != 0);
    }
    detail::JsonAddMember(local_2f8,"bufferViews",(json *)&local_368);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_368);
    model = local_320;
  }
  if ((model->extensionsRequired).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (model->extensionsRequired).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_2a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_2a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"extensionsRequired","");
    SerializeStringArrayProperty((string *)local_2a8,&model->extensionsRequired,local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_);
    }
  }
  if ((model->materials).super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (model->materials).super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_2d8.m_type = null;
    local_2d8.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2d8,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2d8,true);
    if ((model->materials).
        super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->materials).
        super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar27 = 0;
      uVar24 = 1;
      do {
        local_2c8.m_type = null;
        local_2c8.m_value.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2c8,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2c8,true);
        pMVar10 = (model->materials).
                  super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar44 = pMVar10 + uVar27;
        if (pMVar10[uVar27].name._M_string_length != 0) {
          local_2a8[0x10] = 'n';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeStringProperty((string *)local_2a8,&pMVar44->name,&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (1e-12 <= ABS(0.5 - pMVar44->alphaCutoff)) {
          local_2a8[0x10] = 'a';
          local_2a8[0x11] = 'l';
          local_2a8[0x12] = 'p';
          local_2a8[0x13] = 'h';
          local_2a8[0x14] = 'a';
          local_2a8[0x15] = 'C';
          local_2a8[0x16] = 'u';
          local_2a8[0x17] = 't';
          auStack_290[0] = 'o';
          auStack_290[1] = 'f';
          auStack_290[2] = 'f';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xb;
          auStack_290[3] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<double>((string *)local_2a8,pMVar44->alphaCutoff,&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        iVar21 = std::__cxx11::string::compare((char *)&pMVar44->alphaMode);
        if (iVar21 != 0) {
          local_2a8[0x10] = 'a';
          local_2a8[0x11] = 'l';
          local_2a8[0x12] = 'p';
          local_2a8[0x13] = 'h';
          local_2a8[0x14] = 'a';
          local_2a8[0x15] = 'M';
          local_2a8[0x16] = 'o';
          local_2a8[0x17] = 'd';
          auStack_290[0] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x9;
          auStack_290[1] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeStringProperty((string *)local_2a8,&pMVar44->alphaMode,&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (pMVar44->doubleSided == true) {
          local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffffffffff00;
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
          construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_2a8,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2a8,true);
          detail::JsonAddMember(&local_2c8,"doubleSided",(json *)local_2a8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_2a8);
        }
        if (-1 < (pMVar44->normalTexture).index) {
          local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
          local_368._M_string_length = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_368,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_368,true);
          local_2a8[0x14] = 'x';
          local_2a8[0x10] = 'i';
          local_2a8[0x11] = 'n';
          local_2a8[0x12] = 'd';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x5;
          local_2a8[0x15] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<int>
                    ((string *)local_2a8,(pMVar44->normalTexture).index,(json *)&local_368);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
          iVar21 = (pMVar44->normalTexture).texCoord;
          if (iVar21 != 0) {
            local_2a8[0x10] = 't';
            local_2a8[0x11] = 'e';
            local_2a8[0x12] = 'x';
            local_2a8[0x13] = 'C';
            local_2a8[0x14] = 'o';
            local_2a8[0x15] = 'o';
            local_2a8[0x16] = 'r';
            local_2a8[0x17] = 'd';
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x8;
            auStack_290[0] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeNumberProperty<int>((string *)local_2a8,iVar21,(json *)&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
          }
          dVar4 = (pMVar44->normalTexture).scale;
          if (1e-12 <= ABS(1.0 - dVar4)) {
            local_2a8[0x14] = 'e';
            local_2a8[0x10] = 's';
            local_2a8[0x11] = 'c';
            local_2a8[0x12] = 'a';
            local_2a8[0x13] = 'l';
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x5;
            local_2a8[0x15] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
          }
          SerializeExtensionMap(&(pMVar44->normalTexture).extensions,(json *)&local_368);
          SerializeExtras(&(pMVar44->normalTexture).extras,(json *)&local_368);
          detail::JsonAddMember(&local_2c8,"normalTexture",(json *)&local_368);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_368);
        }
        if (-1 < (pMVar44->occlusionTexture).index) {
          local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
          local_368._M_string_length = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_368,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_368,true);
          local_2a8[0x14] = 'x';
          local_2a8[0x10] = 'i';
          local_2a8[0x11] = 'n';
          local_2a8[0x12] = 'd';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ = (pointer)0x5;
          local_2a8[0x15] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<int>
                    ((string *)local_2a8,(pMVar44->occlusionTexture).index,(json *)&local_368);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
          iVar21 = (pMVar44->occlusionTexture).texCoord;
          if (iVar21 != 0) {
            local_2a8[0x10] = 't';
            local_2a8[0x11] = 'e';
            local_2a8[0x12] = 'x';
            local_2a8[0x13] = 'C';
            local_2a8[0x14] = 'o';
            local_2a8[0x15] = 'o';
            local_2a8[0x16] = 'r';
            local_2a8[0x17] = 'd';
            local_2a8._8_8_ = (pointer)0x8;
            auStack_290[0] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeNumberProperty<int>((string *)local_2a8,iVar21,(json *)&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
          }
          dVar4 = (pMVar44->occlusionTexture).strength;
          if (1e-12 <= ABS(1.0 - dVar4)) {
            local_2a8[0x10] = 's';
            local_2a8[0x11] = 't';
            local_2a8[0x12] = 'r';
            local_2a8[0x13] = 'e';
            local_2a8[0x14] = 'n';
            local_2a8[0x15] = 'g';
            local_2a8[0x16] = 't';
            local_2a8[0x17] = 'h';
            local_2a8._8_8_ = (pointer)0x8;
            auStack_290[0] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
          }
          SerializeExtensionMap(&(pMVar44->occlusionTexture).extensions,(json *)&local_368);
          SerializeExtras(&(pMVar44->occlusionTexture).extras,(json *)&local_368);
          detail::JsonAddMember(&local_2c8,"occlusionTexture",(json *)&local_368);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_368);
        }
        if (-1 < (pMVar44->emissiveTexture).index) {
          local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffffffffff00;
          local_2a8._8_8_ = (object_t *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2a8,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2a8,true);
          SerializeGltfTextureInfo(&pMVar44->emissiveTexture,(json *)local_2a8);
          detail::JsonAddMember(&local_2c8,"emissiveTexture",(json *)local_2a8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_2a8);
        }
        local_2a8._0_8_ = (pointer)0x0;
        local_2a8._8_8_ = (object_t *)0x0;
        local_2a8[0x10] = '\0';
        local_2a8[0x11] = '\0';
        local_2a8[0x12] = '\0';
        local_2a8[0x13] = '\0';
        local_2a8[0x14] = '\0';
        local_2a8[0x15] = '\0';
        local_2a8[0x16] = '\0';
        local_2a8[0x17] = '\0';
        __l._M_len = 3;
        __l._M_array = (iterator)local_2a8;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_2f0,__l,(allocator_type *)&local_368);
        bVar20 = Equals(&pMVar44->emissiveFactor,&local_2f0);
        if (!bVar20) {
          auStack_290[0] = 'F';
          auStack_290[1] = 'a';
          auStack_290[2] = 'c';
          auStack_290[3] = 't';
          auStack_290[4] = 'o';
          auStack_290[5] = 'r';
          local_2a8[0x10] = 'e';
          local_2a8[0x11] = 'm';
          local_2a8[0x12] = 'i';
          local_2a8[0x13] = 's';
          local_2a8[0x14] = 's';
          local_2a8[0x15] = 'i';
          local_2a8[0x16] = 'v';
          local_2a8[0x17] = 'e';
          local_2a8._8_8_ = (pointer)0xe;
          auStack_290[6] = '\0';
          local_2a8._0_8_ = local_2a8 + 0x10;
          SerializeNumberArrayProperty<double>
                    ((string *)local_2a8,&pMVar44->emissiveFactor,&local_2c8);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        local_2a8[0x10] = '\0';
        local_2a8[0x11] = '\0';
        local_2a8[0x12] = '\0';
        local_2a8[0x13] = '\0';
        local_2a8[0x14] = '\0';
        local_2a8[0x15] = '\0';
        local_2a8[0x16] = -0x10;
        local_2a8[0x17] = '?';
        auStack_290[0] = '\0';
        auStack_290[1] = '\0';
        auStack_290[2] = '\0';
        auStack_290[3] = '\0';
        auStack_290[4] = '\0';
        auStack_290[5] = '\0';
        auStack_290[6] = -0x10;
        auStack_290[7] = '?';
        local_2a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3ff0000000000000;
        local_2a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3ff0000000000000;
        __l_00._M_len = 4;
        __l_00._M_array = (iterator)local_2a8;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_368,__l_00,
                   (allocator_type *)&local_318);
        bVar20 = Equals(&(pMVar44->pbrMetallicRoughness).baseColorFactor,
                        (vector<double,_std::allocator<double>_> *)&local_368);
        if (!bVar20) {
          auStack_290[0] = 'r';
          auStack_290[1] = 'F';
          auStack_290[2] = 'a';
          auStack_290[3] = 'c';
          auStack_290[4] = 't';
          auStack_290[5] = 'o';
          auStack_290[6] = 'r';
          local_2a8[0x10] = 'b';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 's';
          local_2a8[0x13] = 'e';
          local_2a8[0x14] = 'C';
          local_2a8[0x15] = 'o';
          local_2a8[0x16] = 'l';
          local_2a8[0x17] = 'o';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
          auStack_290[7] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberArrayProperty<double>
                    ((string *)local_2a8,&(pMVar44->pbrMetallicRoughness).baseColorFactor,
                     (json *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        dVar4 = (pMVar44->pbrMetallicRoughness).metallicFactor;
        if (1e-12 <= ABS(1.0 - dVar4)) {
          auStack_290[0] = 'F';
          auStack_290[1] = 'a';
          auStack_290[2] = 'c';
          auStack_290[3] = 't';
          auStack_290[4] = 'o';
          auStack_290[5] = 'r';
          local_2a8[0x10] = 'm';
          local_2a8[0x11] = 'e';
          local_2a8[0x12] = 't';
          local_2a8[0x13] = 'a';
          local_2a8[0x14] = 'l';
          local_2a8[0x15] = 'l';
          local_2a8[0x16] = 'i';
          local_2a8[0x17] = 'c';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xe;
          auStack_290[6] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        dVar4 = (pMVar44->pbrMetallicRoughness).roughnessFactor;
        if (1e-12 <= ABS(1.0 - dVar4)) {
          auStack_290[0] = 's';
          auStack_290[1] = 'F';
          auStack_290[2] = 'a';
          auStack_290[3] = 'c';
          auStack_290[4] = 't';
          auStack_290[5] = 'o';
          auStack_290[6] = 'r';
          local_2a8[0x10] = 'r';
          local_2a8[0x11] = 'o';
          local_2a8[0x12] = 'u';
          local_2a8[0x13] = 'g';
          local_2a8[0x14] = 'h';
          local_2a8[0x15] = 'n';
          local_2a8[0x16] = 'e';
          local_2a8[0x17] = 's';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
          auStack_290[7] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (-1 < (pMVar44->pbrMetallicRoughness).baseColorTexture.index) {
          local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffffffffff00;
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2a8,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2a8,true);
          SerializeGltfTextureInfo
                    (&(pMVar44->pbrMetallicRoughness).baseColorTexture,(json *)local_2a8);
          detail::JsonAddMember((json *)local_348,"baseColorTexture",(json *)local_2a8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_2a8);
        }
        if (-1 < (pMVar44->pbrMetallicRoughness).metallicRoughnessTexture.index) {
          local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffffffffff00;
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2a8,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_2a8,true);
          SerializeGltfTextureInfo
                    (&(pMVar44->pbrMetallicRoughness).metallicRoughnessTexture,(json *)local_2a8);
          detail::JsonAddMember((json *)local_348,"metallicRoughnessTexture",(json *)local_2a8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_2a8);
        }
        SerializeExtensionMap(&(pMVar44->pbrMetallicRoughness).extensions,(json *)local_348);
        SerializeExtras(&(pMVar44->pbrMetallicRoughness).extras,(json *)local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_368._M_dataplus._M_p);
        }
        if (local_348[0] != null) {
          detail::JsonAddMember(&local_2c8,"pbrMetallicRoughness",(json *)local_348);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        SerializeExtensionMap(&pMVar44->extensions,&local_2c8);
        SerializeExtras(&pMVar44->extras,&local_2c8);
        if (*(pointer *)&(pMVar44->lods).super__Vector_base<int,_std::allocator<int>_> ==
            *(pointer *)((long)&(pMVar44->lods).super__Vector_base<int,_std::allocator<int>_> + 8))
        {
          local_348._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_348._0_8_ = (pointer)0x0;
          local_348._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          pStack_330.m_it = -0x8000000000000000;
          bVar20 = detail::FindMember(&local_2c8,"extensions",(json_iterator *)local_348);
          if (bVar20) {
            pbVar26 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_348);
            local_318.field_2._M_allocated_capacity = 0;
            local_318._M_dataplus._M_p = (pointer)0x0;
            local_318._M_string_length = 0;
            local_318.field_2._8_8_ = 0x8000000000000000;
            bVar20 = detail::FindMember(pbVar26,"MSFT_lod",(json_iterator *)&local_318);
            if (bVar20) {
              local_2a8._0_8_ = local_318._M_dataplus._M_p;
              auStack_290[0] = (undefined1)local_318.field_2._8_8_;
              auStack_290[1] = (undefined1)((ulong)local_318.field_2._8_8_ >> 8);
              auStack_290[2] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x10);
              auStack_290[3] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x18);
              auStack_290[4] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x20);
              auStack_290[5] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x28);
              auStack_290[6] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x30);
              auStack_290[7] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x38);
              local_2a8._8_8_ = local_318._M_string_length;
              local_2a8[0x10] = (undefined1)local_318.field_2._M_allocated_capacity;
              local_2a8[0x11] = (undefined1)((ulong)local_318.field_2._0_8_ >> 8);
              local_2a8[0x12] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x10);
              local_2a8[0x13] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x18);
              local_2a8[0x14] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x20);
              local_2a8[0x15] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x28);
              local_2a8[0x16] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x30);
              local_2a8[0x17] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x38);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_368,pbVar26,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2a8);
            }
            vVar5 = pbVar26->m_type;
            if (vVar5 != null) {
              if (vVar5 == object) {
                bVar20 = (((pbVar26->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                         _M_node_count == 0;
              }
              else {
                if (vVar5 != array) goto LAB_001201c3;
                bVar20 = (((pbVar26->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start ==
                         (((pbVar26->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              }
              if (!bVar20) goto LAB_001201c3;
            }
            local_2a8._0_8_ = local_348._0_8_;
            auStack_290[0] = (undefined1)pStack_330.m_it;
            auStack_290[1] = (undefined1)((ulong)pStack_330.m_it >> 8);
            auStack_290[2] = (undefined1)((ulong)pStack_330.m_it >> 0x10);
            auStack_290[3] = (undefined1)((ulong)pStack_330.m_it >> 0x18);
            auStack_290[4] = (undefined1)((ulong)pStack_330.m_it >> 0x20);
            auStack_290[5] = (undefined1)((ulong)pStack_330.m_it >> 0x28);
            auStack_290[6] = (undefined1)((ulong)pStack_330.m_it >> 0x30);
            auStack_290[7] = (undefined1)((ulong)pStack_330.m_it >> 0x38);
            local_2a8._8_8_ = local_348._8_8_;
            local_2a8[0x10] = (undefined1)local_348._16_8_;
            local_2a8[0x11] = SUB81(local_348._16_8_,1);
            local_2a8[0x12] = SUB81(local_348._16_8_,2);
            local_2a8[0x13] = SUB81(local_348._16_8_,3);
            local_2a8[0x14] = SUB81(local_348._16_8_,4);
            local_2a8[0x15] = SUB81(local_348._16_8_,5);
            local_2a8[0x16] = SUB81(local_348._16_8_,6);
            local_2a8[0x17] = SUB81(local_348._16_8_,7);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                      ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_368,&local_2c8,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_2a8);
          }
        }
        else {
          local_2a8[0x10] = '\0';
          local_2a8[0x11] = '\0';
          local_2a8[0x12] = '\0';
          local_2a8[0x13] = '\0';
          local_2a8[0x14] = '\0';
          local_2a8[0x15] = '\0';
          local_2a8[0x16] = '\0';
          local_2a8[0x17] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          auStack_290[0] = '\0';
          auStack_290[1] = '\0';
          auStack_290[2] = '\0';
          auStack_290[3] = '\0';
          auStack_290[4] = '\0';
          auStack_290[5] = '\0';
          auStack_290[6] = '\0';
          auStack_290[7] = -0x80;
          bVar20 = detail::FindMember(&local_2c8,"extensions",(json_iterator *)local_2a8);
          if (!bVar20) {
            local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
            local_368._M_string_length = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            detail::JsonSetObject((json *)&local_368);
            detail::JsonAddMember(&local_2c8,"extensions",(json *)&local_368);
            detail::FindMember(&local_2c8,"extensions",(json_iterator *)local_2a8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_368);
          }
          pbVar26 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2a8);
          bVar20 = detail::FindMember(pbVar26,"MSFT_lod",(json_iterator *)local_2a8);
          if (!bVar20) {
            local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
            local_368._M_string_length = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            detail::JsonSetObject((json *)&local_368);
            detail::JsonAddMember(pbVar26,"MSFT_lod",(json *)&local_368);
            detail::FindMember(pbVar26,"MSFT_lod",(json_iterator *)local_2a8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_368);
          }
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          local_368.field_2._M_local_buf[2] = 's';
          local_368.field_2._M_local_buf[0] = 'i';
          local_368.field_2._M_local_buf[1] = 'd';
          local_368._M_string_length = 3;
          local_368.field_2._M_local_buf[3] = '\0';
          pbVar26 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2a8);
          SerializeNumberArrayProperty<int>(&local_368,&pMVar44->lods,pbVar26);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
        }
LAB_001201c3:
        if ((void *)CONCAT71(local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,
                             local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_2f0.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                                           local_2f0.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_1_));
        }
        if (local_2c8.m_type == null) {
          detail::JsonSetObject(&local_2c8);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back(&local_2d8,&local_2c8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_2c8);
        uVar27 = ((long)(local_320->materials).
                        super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_320->materials).
                        super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x2a825c935d853211;
        bVar20 = uVar24 <= uVar27;
        lVar48 = uVar27 - uVar24;
        model = local_320;
        uVar27 = uVar24;
        uVar24 = (ulong)((int)uVar24 + 1);
      } while (bVar20 && lVar48 != 0);
    }
    detail::JsonAddMember(local_2f8,"materials",&local_2d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_2d8);
    model = local_320;
  }
  if ((model->meshes).super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->meshes).super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2d8.m_type = null;
    local_2d8.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2d8,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2d8,true);
    if ((model->meshes).super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->meshes).super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar27 = 0;
      do {
        local_2c8.m_type = null;
        local_2c8.m_value.object = (object_t *)0x0;
        local_48 = uVar27;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2c8,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2c8,true);
        pMVar33 = (model->meshes).
                  super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
        local_368._M_string_length = 0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&local_368,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&local_368,true);
        local_60 = pMVar33 + uVar27;
        if (*(pointer *)
             ((long)&pMVar33[uVar27].primitives.
                     super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>.
                     _M_impl + 8) !=
            *(pointer *)
             &pMVar33[uVar27].primitives.
              super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>._M_impl)
        {
          pEVar34 = (ExtensionMap *)0x0;
          do {
            pMVar33 = local_60;
            local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
            local_348._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_348,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_348,true);
            pPVar11 = (pMVar33->primitives).
                      super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffffffffff00;
            local_2a8._8_8_ = (object_t *)0x0;
            local_68 = pEVar34;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_2a8,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_2a8,true);
            for (p_Var28 = *(_Rb_tree_node_base **)((long)(pPVar11 + (long)pEVar34) + 0x18);
                p_Var28 != (_Rb_tree_node_base *)((long)(pPVar11 + (long)pEVar34) + 8U);
                p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28)) {
              SerializeNumberProperty<int>
                        ((string *)(p_Var28 + 1),p_Var28[2]._M_color,(json *)local_2a8);
            }
            detail::JsonAddMember
                      ((json *)local_348,"attributes",
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_2a8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_2a8);
            paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_2a8 + 0x10);
            if (-1 < *(int *)((long)(pPVar11 + (long)pEVar34) + 0x34)) {
              local_2a8[0x14] = 'c';
              local_2a8[0x15] = 'e';
              local_2a8[0x16] = 's';
              local_2a8[0x10] = 'i';
              local_2a8[0x11] = 'n';
              local_2a8[0x12] = 'd';
              local_2a8[0x13] = 'i';
              local_2a8._8_8_ = (pointer)0x7;
              local_2a8[0x17] = '\0';
              local_2a8._0_8_ = paVar2;
              SerializeNumberProperty<int>
                        ((string *)local_2a8,*(int *)((long)(pPVar11 + (long)pEVar34) + 0x34),
                         (json *)local_348);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._0_8_ != paVar2) {
                operator_delete((void *)local_2a8._0_8_);
              }
            }
            if (-1 < *(int *)((long)(pPVar11 + (long)pEVar34) + 0x30)) {
              local_2a8[0x10] = 'm';
              local_2a8[0x11] = 'a';
              local_2a8[0x12] = 't';
              local_2a8[0x13] = 'e';
              local_2a8[0x14] = 'r';
              local_2a8[0x15] = 'i';
              local_2a8[0x16] = 'a';
              local_2a8[0x17] = 'l';
              local_2a8._8_8_ = (pointer)0x8;
              auStack_290[0] = '\0';
              local_2a8._0_8_ = paVar2;
              SerializeNumberProperty<int>
                        ((string *)local_2a8,*(int *)((long)(pPVar11 + (long)pEVar34) + 0x30),
                         (json *)local_348);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._0_8_ != paVar2) {
                operator_delete((void *)local_2a8._0_8_);
              }
            }
            local_2a8[0x10] = 'm';
            local_2a8[0x11] = 'o';
            local_2a8[0x12] = 'd';
            local_2a8[0x13] = 'e';
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x4;
            local_2a8[0x14] = '\0';
            local_2a8._0_8_ = paVar2;
            SerializeNumberProperty<int>
                      ((string *)local_2a8,*(int *)((long)(pPVar11 + (long)pEVar34) + 0x38),
                       (json *)local_348);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ != paVar2) {
              operator_delete((void *)local_2a8._0_8_);
            }
            if (*(long *)((long)(pPVar11 + (long)pEVar34) + 0x48) !=
                *(long *)((long)(pPVar11 + (long)pEVar34) + 0x40)) {
              local_318._M_dataplus._M_p = local_318._M_dataplus._M_p & 0xffffffffffffff00;
              local_318._M_string_length = 0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_318,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_318,true);
              if (*(long *)((long)(pPVar11 + (long)pEVar34) + 0x48) !=
                  *(long *)((long)(pPVar11 + (long)pEVar34) + 0x40)) {
                uVar27 = 0;
                do {
                  local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_ =
                       (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0;
                  local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)&local_2f0,true);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)&local_2f0,true);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)local_2a8,
                             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)(uVar27 * 0x30 + *(long *)((long)(pPVar11 + (long)pEVar34) + 0x40)))
                  ;
                  for (p_Var28 = (_Rb_tree_node_base *)
                                 CONCAT17(auStack_290[7],
                                          CONCAT16(auStack_290[6],
                                                   CONCAT15(auStack_290[5],
                                                            CONCAT14(auStack_290[4],
                                                                     CONCAT13(auStack_290[3],
                                                                              CONCAT12(auStack_290
                                                                                       [2],CONCAT11(
                                                  auStack_290[1],auStack_290[0])))))));
                      p_Var28 != (_Rb_tree_node_base *)(local_2a8 + 8);
                      p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28)) {
                    SerializeNumberProperty<int>
                              ((string *)(p_Var28 + 1),p_Var28[2]._M_color,
                               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_2f0);
                  }
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_318,
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_2f0);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_2a8);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)&local_2f0);
                  uVar27 = (ulong)((int)uVar27 + 1);
                  uVar24 = (*(long *)((long)(pPVar11 + (long)pEVar34) + 0x48) -
                            *(long *)((long)(pPVar11 + (long)pEVar34) + 0x40) >> 4) *
                           -0x5555555555555555;
                } while (uVar27 <= uVar24 && uVar24 - uVar27 != 0);
              }
              detail::JsonAddMember((json *)local_348,"targets",(json *)&local_318);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&local_318);
            }
            SerializeExtensionMap
                      ((ExtensionMap *)((long)(pPVar11 + (long)pEVar34) + 0x58),
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_348);
            SerializeExtras((Value *)((long)(pPVar11 + (long)pEVar34) + 0x88),
                            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)local_348);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_368,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_348);
            pEVar34 = (ExtensionMap *)(ulong)((int)local_68 + 1);
            pEVar22 = (ExtensionMap *)
                      (((long)*(pointer *)
                               ((long)&(local_60->primitives).
                                       super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>
                                       ._M_impl + 8) -
                        (long)(local_60->primitives).
                              super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) * 0x2e8ba2e8ba2e8ba3);
          } while (pEVar34 <= pEVar22 && (long)pEVar22 - (long)pEVar34 != 0);
        }
        pMVar33 = local_60;
        detail::JsonAddMember(&local_2c8,"primitives",(json *)&local_368);
        model = local_320;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
        if (*(pointer *)
             ((long)&(pMVar33->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl
             + 8) != *(pointer *)
                      &(pMVar33->weights).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl) {
          local_2a8[0x14] = 'h';
          local_2a8[0x15] = 't';
          local_2a8[0x16] = 's';
          local_2a8[0x10] = 'w';
          local_2a8[0x11] = 'e';
          local_2a8[0x12] = 'i';
          local_2a8[0x13] = 'g';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x7;
          local_2a8[0x17] = '\0';
          local_2a8._0_8_ = paVar2;
          SerializeNumberArrayProperty<double>((string *)local_2a8,&pMVar33->weights,&local_2c8);
          pMVar33 = local_60;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ != paVar2) {
            operator_delete((void *)local_2a8._0_8_);
            pMVar33 = local_60;
          }
        }
        if ((pMVar33->name)._M_string_length != 0) {
          local_2a8[0x10] = 'n';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ = paVar2;
          SerializeStringProperty((string *)local_2a8,&pMVar33->name,&local_2c8);
          pMVar33 = local_60;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ != paVar2) {
            operator_delete((void *)local_2a8._0_8_);
            pMVar33 = local_60;
          }
        }
        SerializeExtensionMap(&pMVar33->extensions,&local_2c8);
        SerializeExtras(&pMVar33->extras,&local_2c8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&local_368);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back(&local_2d8,&local_2c8);
        uVar27 = local_48;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_2c8);
        uVar27 = (ulong)((int)uVar27 + 1);
        uVar24 = ((long)(model->meshes).
                        super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(model->meshes).
                        super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d;
      } while (uVar27 <= uVar24 && uVar24 - uVar27 != 0);
    }
    detail::JsonAddMember(local_2f8,"meshes",&local_2d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_2d8);
  }
  if ((model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0;
    local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    uVar36 = 1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f0,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f0,true);
    if ((model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar27 = 0;
      do {
        local_2d8.m_type = null;
        local_2d8.m_value.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2d8,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2d8,true);
        pNVar32 = (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pNVar32[uVar27].translation.super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl + 8) !=
            *(pointer *)
             &pNVar32[uVar27].translation.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl) {
          local_2a8[0x10] = 't';
          local_2a8[0x11] = 'r';
          local_2a8[0x12] = 'a';
          local_2a8[0x13] = 'n';
          local_2a8[0x14] = 's';
          local_2a8[0x15] = 'l';
          local_2a8[0x16] = 'a';
          local_2a8[0x17] = 't';
          auStack_290[0] = 'i';
          auStack_290[1] = 'o';
          auStack_290[2] = 'n';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xb;
          auStack_290[3] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberArrayProperty<double>
                    ((string *)local_2a8,&pNVar32[uVar27].translation,&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        pNVar32 = pNVar32 + uVar27;
        if (*(pointer *)
             ((long)&(pNVar32->rotation).super__Vector_base<double,_std::allocator<double>_>._M_impl
             + 8) != (pNVar32->rotation).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start) {
          local_2a8[0x10] = 'r';
          local_2a8[0x11] = 'o';
          local_2a8[0x12] = 't';
          local_2a8[0x13] = 'a';
          local_2a8[0x14] = 't';
          local_2a8[0x15] = 'i';
          local_2a8[0x16] = 'o';
          local_2a8[0x17] = 'n';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x8;
          auStack_290[0] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberArrayProperty<double>((string *)local_2a8,&pNVar32->rotation,&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (*(pointer *)
             ((long)&(pNVar32->scale).super__Vector_base<double,_std::allocator<double>_>._M_impl +
             8) != (pNVar32->scale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
          local_2a8[0x14] = 'e';
          local_2a8[0x10] = 's';
          local_2a8[0x11] = 'c';
          local_2a8[0x12] = 'a';
          local_2a8[0x13] = 'l';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x5;
          local_2a8[0x15] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberArrayProperty<double>((string *)local_2a8,&pNVar32->scale,&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (*(pointer *)
             ((long)&(pNVar32->matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl +
             8) != (pNVar32->matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
          local_2a8[0x14] = 'i';
          local_2a8[0x15] = 'x';
          local_2a8[0x10] = 'm';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 't';
          local_2a8[0x13] = 'r';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x6;
          local_2a8[0x16] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberArrayProperty<double>((string *)local_2a8,&pNVar32->matrix,&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (pNVar32->mesh != -1) {
          local_2a8[0x10] = 'm';
          local_2a8[0x11] = 'e';
          local_2a8[0x12] = 's';
          local_2a8[0x13] = 'h';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<int>((string *)local_2a8,pNVar32->mesh,&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (pNVar32->skin != -1) {
          local_2a8[0x10] = 's';
          local_2a8[0x11] = 'k';
          local_2a8[0x12] = 'i';
          local_2a8[0x13] = 'n';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<int>((string *)local_2a8,pNVar32->skin,&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (pNVar32->camera != -1) {
          local_2a8[0x14] = 'r';
          local_2a8[0x15] = 'a';
          local_2a8[0x10] = 'c';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x6;
          local_2a8[0x16] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<int>((string *)local_2a8,pNVar32->camera,&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (*(pointer *)
             ((long)&(pNVar32->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl
             + 8) != (pNVar32->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) {
          local_2a8[0x14] = 'h';
          local_2a8[0x15] = 't';
          local_2a8[0x16] = 's';
          local_2a8[0x10] = 'w';
          local_2a8[0x11] = 'e';
          local_2a8[0x12] = 'i';
          local_2a8[0x13] = 'g';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x7;
          local_2a8[0x17] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberArrayProperty<double>((string *)local_2a8,&pNVar32->weights,&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        SerializeExtensionMap(&pNVar32->extensions,&local_2d8);
        SerializeExtras(&pNVar32->extras,&local_2d8);
        if (pNVar32->light == -1) {
          local_348._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_348._0_8_ = (pointer)0x0;
          local_348._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          pStack_330.m_it = -0x8000000000000000;
          bVar20 = detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_348);
          if (bVar20) {
            pbVar26 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_348);
            local_318.field_2._M_allocated_capacity = 0;
            local_318._M_dataplus._M_p = (pointer)0x0;
            local_318._M_string_length = 0;
            local_318.field_2._8_8_ = 0x8000000000000000;
            bVar20 = detail::FindMember(pbVar26,"KHR_lights_punctual",(json_iterator *)&local_318);
            if (bVar20) {
              local_2a8._0_8_ = local_318._M_dataplus._M_p;
              auStack_290[0] = (undefined1)local_318.field_2._8_8_;
              auStack_290[1] = (undefined1)((ulong)local_318.field_2._8_8_ >> 8);
              auStack_290[2] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x10);
              auStack_290[3] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x18);
              auStack_290[4] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x20);
              auStack_290[5] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x28);
              auStack_290[6] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x30);
              auStack_290[7] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x38);
              local_2a8._8_8_ = local_318._M_string_length;
              local_2a8[0x10] = (undefined1)local_318.field_2._M_allocated_capacity;
              local_2a8[0x11] = (undefined1)((ulong)local_318.field_2._0_8_ >> 8);
              local_2a8[0x12] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x10);
              local_2a8[0x13] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x18);
              local_2a8[0x14] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x20);
              local_2a8[0x15] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x28);
              local_2a8[0x16] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x30);
              local_2a8[0x17] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x38);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_368,pbVar26,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2a8);
            }
            vVar5 = pbVar26->m_type;
            if (vVar5 != null) {
              if (vVar5 == object) {
                bVar20 = (((pbVar26->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                         _M_node_count == 0;
              }
              else {
                if (vVar5 != array) goto LAB_00120eb7;
                bVar20 = (((pbVar26->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start ==
                         (((pbVar26->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              }
              if (!bVar20) goto LAB_00120eb7;
            }
            local_2a8._0_8_ = local_348._0_8_;
            auStack_290[0] = (undefined1)pStack_330.m_it;
            auStack_290[1] = (undefined1)((ulong)pStack_330.m_it >> 8);
            auStack_290[2] = (undefined1)((ulong)pStack_330.m_it >> 0x10);
            auStack_290[3] = (undefined1)((ulong)pStack_330.m_it >> 0x18);
            auStack_290[4] = (undefined1)((ulong)pStack_330.m_it >> 0x20);
            auStack_290[5] = (undefined1)((ulong)pStack_330.m_it >> 0x28);
            auStack_290[6] = (undefined1)((ulong)pStack_330.m_it >> 0x30);
            auStack_290[7] = (undefined1)((ulong)pStack_330.m_it >> 0x38);
            local_2a8._8_8_ = local_348._8_8_;
            local_2a8[0x10] = (undefined1)local_348._16_8_;
            local_2a8[0x11] = SUB81(local_348._16_8_,1);
            local_2a8[0x12] = SUB81(local_348._16_8_,2);
            local_2a8[0x13] = SUB81(local_348._16_8_,3);
            local_2a8[0x14] = SUB81(local_348._16_8_,4);
            local_2a8[0x15] = SUB81(local_348._16_8_,5);
            local_2a8[0x16] = SUB81(local_348._16_8_,6);
            local_2a8[0x17] = SUB81(local_348._16_8_,7);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                      ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_368,&local_2d8,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_2a8);
          }
        }
        else {
          local_2a8[0x10] = '\0';
          local_2a8[0x11] = '\0';
          local_2a8[0x12] = '\0';
          local_2a8[0x13] = '\0';
          local_2a8[0x14] = '\0';
          local_2a8[0x15] = '\0';
          local_2a8[0x16] = '\0';
          local_2a8[0x17] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          auStack_290[0] = '\0';
          auStack_290[1] = '\0';
          auStack_290[2] = '\0';
          auStack_290[3] = '\0';
          auStack_290[4] = '\0';
          auStack_290[5] = '\0';
          auStack_290[6] = '\0';
          auStack_290[7] = -0x80;
          bVar20 = detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_2a8);
          if (!bVar20) {
            local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
            local_368._M_string_length = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            detail::JsonSetObject((json *)&local_368);
            detail::JsonAddMember(&local_2d8,"extensions",(json *)&local_368);
            detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_2a8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_368);
          }
          pbVar26 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2a8);
          bVar20 = detail::FindMember(pbVar26,"KHR_lights_punctual",(json_iterator *)local_2a8);
          if (!bVar20) {
            local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
            local_368._M_string_length = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            detail::JsonSetObject((json *)&local_368);
            detail::JsonAddMember(pbVar26,"KHR_lights_punctual",(json *)&local_368);
            detail::FindMember(pbVar26,"KHR_lights_punctual",(json_iterator *)local_2a8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_368);
          }
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          local_368.field_2._M_local_buf[4] = 't';
          local_368.field_2._M_local_buf[0] = 'l';
          local_368.field_2._M_local_buf[1] = 'i';
          local_368.field_2._M_local_buf[2] = 'g';
          local_368.field_2._M_local_buf[3] = 'h';
          local_368._M_string_length = 5;
          local_368.field_2._M_local_buf[5] = '\0';
          iVar21 = pNVar32->light;
          pbVar26 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2a8);
          SerializeNumberProperty<int>(&local_368,iVar21,pbVar26);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
        }
LAB_00120eb7:
        if (pNVar32->emitter == -1) {
          local_348._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_348._0_8_ = (pointer)0x0;
          local_348._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          pStack_330.m_it = -0x8000000000000000;
          bVar20 = detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_348);
          if (bVar20) {
            pbVar26 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_348);
            local_318.field_2._M_allocated_capacity = 0;
            local_318._M_dataplus._M_p = (pointer)0x0;
            local_318._M_string_length = 0;
            local_318.field_2._8_8_ = 0x8000000000000000;
            bVar20 = detail::FindMember(pbVar26,"KHR_audio",(json_iterator *)&local_318);
            if (bVar20) {
              local_2a8._0_8_ = local_318._M_dataplus._M_p;
              auStack_290[0] = (undefined1)local_318.field_2._8_8_;
              auStack_290[1] = (undefined1)((ulong)local_318.field_2._8_8_ >> 8);
              auStack_290[2] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x10);
              auStack_290[3] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x18);
              auStack_290[4] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x20);
              auStack_290[5] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x28);
              auStack_290[6] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x30);
              auStack_290[7] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x38);
              local_2a8._8_8_ = local_318._M_string_length;
              local_2a8[0x10] = (undefined1)local_318.field_2._M_allocated_capacity;
              local_2a8[0x11] = (undefined1)((ulong)local_318.field_2._0_8_ >> 8);
              local_2a8[0x12] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x10);
              local_2a8[0x13] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x18);
              local_2a8[0x14] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x20);
              local_2a8[0x15] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x28);
              local_2a8[0x16] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x30);
              local_2a8[0x17] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x38);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_368,pbVar26,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2a8);
            }
            vVar5 = pbVar26->m_type;
            if (vVar5 != null) {
              if (vVar5 == object) {
                bVar20 = (((pbVar26->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                         _M_node_count == 0;
              }
              else {
                if (vVar5 != array) goto LAB_00121155;
                bVar20 = (((pbVar26->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start ==
                         (((pbVar26->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              }
              if (!bVar20) goto LAB_00121155;
            }
            local_2a8._0_8_ = local_348._0_8_;
            auStack_290[0] = (undefined1)pStack_330.m_it;
            auStack_290[1] = (undefined1)((ulong)pStack_330.m_it >> 8);
            auStack_290[2] = (undefined1)((ulong)pStack_330.m_it >> 0x10);
            auStack_290[3] = (undefined1)((ulong)pStack_330.m_it >> 0x18);
            auStack_290[4] = (undefined1)((ulong)pStack_330.m_it >> 0x20);
            auStack_290[5] = (undefined1)((ulong)pStack_330.m_it >> 0x28);
            auStack_290[6] = (undefined1)((ulong)pStack_330.m_it >> 0x30);
            auStack_290[7] = (undefined1)((ulong)pStack_330.m_it >> 0x38);
            local_2a8._8_8_ = local_348._8_8_;
            local_2a8[0x10] = (undefined1)local_348._16_8_;
            local_2a8[0x11] = SUB81(local_348._16_8_,1);
            local_2a8[0x12] = SUB81(local_348._16_8_,2);
            local_2a8[0x13] = SUB81(local_348._16_8_,3);
            local_2a8[0x14] = SUB81(local_348._16_8_,4);
            local_2a8[0x15] = SUB81(local_348._16_8_,5);
            local_2a8[0x16] = SUB81(local_348._16_8_,6);
            local_2a8[0x17] = SUB81(local_348._16_8_,7);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                      ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_368,&local_2d8,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_2a8);
          }
        }
        else {
          local_2a8[0x10] = '\0';
          local_2a8[0x11] = '\0';
          local_2a8[0x12] = '\0';
          local_2a8[0x13] = '\0';
          local_2a8[0x14] = '\0';
          local_2a8[0x15] = '\0';
          local_2a8[0x16] = '\0';
          local_2a8[0x17] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          auStack_290[0] = '\0';
          auStack_290[1] = '\0';
          auStack_290[2] = '\0';
          auStack_290[3] = '\0';
          auStack_290[4] = '\0';
          auStack_290[5] = '\0';
          auStack_290[6] = '\0';
          auStack_290[7] = -0x80;
          bVar20 = detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_2a8);
          if (!bVar20) {
            local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
            local_368._M_string_length = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            detail::JsonSetObject((json *)&local_368);
            detail::JsonAddMember(&local_2d8,"extensions",(json *)&local_368);
            detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_2a8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_368);
          }
          pbVar26 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2a8);
          bVar20 = detail::FindMember(pbVar26,"KHR_audio",(json_iterator *)local_2a8);
          if (!bVar20) {
            local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
            local_368._M_string_length = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            detail::JsonSetObject((json *)&local_368);
            detail::JsonAddMember(pbVar26,"KHR_audio",(json *)&local_368);
            detail::FindMember(pbVar26,"KHR_audio",(json_iterator *)local_2a8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_368);
          }
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          local_368.field_2._M_local_buf[4] = 't';
          local_368.field_2._M_local_buf[5] = 'e';
          local_368.field_2._M_local_buf[6] = 'r';
          local_368.field_2._M_local_buf[0] = 'e';
          local_368.field_2._M_local_buf[1] = 'm';
          local_368.field_2._M_local_buf[2] = 'i';
          local_368.field_2._M_local_buf[3] = 't';
          local_368._M_string_length = 7;
          local_368.field_2._M_local_buf[7] = '\0';
          iVar21 = pNVar32->emitter;
          pbVar26 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2a8);
          SerializeNumberProperty<int>(&local_368,iVar21,pbVar26);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
        }
LAB_00121155:
        if ((pNVar32->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            *(pointer *)
             ((long)&(pNVar32->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)) {
          local_348._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_348._0_8_ = (pointer)0x0;
          local_348._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          pStack_330.m_it = -0x8000000000000000;
          bVar20 = detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_348);
          if (bVar20) {
            pbVar26 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_348);
            local_318.field_2._M_allocated_capacity = 0;
            local_318._M_dataplus._M_p = (pointer)0x0;
            local_318._M_string_length = 0;
            local_318.field_2._8_8_ = 0x8000000000000000;
            bVar20 = detail::FindMember(pbVar26,"MSFT_lod",(json_iterator *)&local_318);
            if (bVar20) {
              local_2a8._0_8_ = local_318._M_dataplus._M_p;
              auStack_290[0] = (undefined1)local_318.field_2._8_8_;
              auStack_290[1] = (undefined1)((ulong)local_318.field_2._8_8_ >> 8);
              auStack_290[2] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x10);
              auStack_290[3] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x18);
              auStack_290[4] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x20);
              auStack_290[5] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x28);
              auStack_290[6] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x30);
              auStack_290[7] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x38);
              local_2a8._8_8_ = local_318._M_string_length;
              local_2a8[0x10] = (undefined1)local_318.field_2._M_allocated_capacity;
              local_2a8[0x11] = (undefined1)((ulong)local_318.field_2._0_8_ >> 8);
              local_2a8[0x12] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x10);
              local_2a8[0x13] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x18);
              local_2a8[0x14] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x20);
              local_2a8[0x15] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x28);
              local_2a8[0x16] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x30);
              local_2a8[0x17] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x38);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_368,pbVar26,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2a8);
            }
            vVar5 = pbVar26->m_type;
            if (vVar5 != null) {
              if (vVar5 == object) {
                bVar20 = (((pbVar26->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                         _M_node_count == 0;
              }
              else {
                if (vVar5 != array) goto LAB_001213ef;
                bVar20 = (((pbVar26->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start ==
                         (((pbVar26->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              }
              if (!bVar20) goto LAB_001213ef;
            }
            local_2a8._0_8_ = local_348._0_8_;
            auStack_290[0] = (undefined1)pStack_330.m_it;
            auStack_290[1] = (undefined1)((ulong)pStack_330.m_it >> 8);
            auStack_290[2] = (undefined1)((ulong)pStack_330.m_it >> 0x10);
            auStack_290[3] = (undefined1)((ulong)pStack_330.m_it >> 0x18);
            auStack_290[4] = (undefined1)((ulong)pStack_330.m_it >> 0x20);
            auStack_290[5] = (undefined1)((ulong)pStack_330.m_it >> 0x28);
            auStack_290[6] = (undefined1)((ulong)pStack_330.m_it >> 0x30);
            auStack_290[7] = (undefined1)((ulong)pStack_330.m_it >> 0x38);
            local_2a8._8_8_ = local_348._8_8_;
            local_2a8[0x10] = (undefined1)local_348._16_8_;
            local_2a8[0x11] = SUB81(local_348._16_8_,1);
            local_2a8[0x12] = SUB81(local_348._16_8_,2);
            local_2a8[0x13] = SUB81(local_348._16_8_,3);
            local_2a8[0x14] = SUB81(local_348._16_8_,4);
            local_2a8[0x15] = SUB81(local_348._16_8_,5);
            local_2a8[0x16] = SUB81(local_348._16_8_,6);
            local_2a8[0x17] = SUB81(local_348._16_8_,7);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                      ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_368,&local_2d8,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_2a8);
          }
        }
        else {
          local_2a8[0x10] = '\0';
          local_2a8[0x11] = '\0';
          local_2a8[0x12] = '\0';
          local_2a8[0x13] = '\0';
          local_2a8[0x14] = '\0';
          local_2a8[0x15] = '\0';
          local_2a8[0x16] = '\0';
          local_2a8[0x17] = '\0';
          local_2a8._0_8_ = (pointer)0x0;
          local_2a8._8_8_ = (object_t *)0x0;
          auStack_290[0] = '\0';
          auStack_290[1] = '\0';
          auStack_290[2] = '\0';
          auStack_290[3] = '\0';
          auStack_290[4] = '\0';
          auStack_290[5] = '\0';
          auStack_290[6] = '\0';
          auStack_290[7] = -0x80;
          bVar20 = detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_2a8);
          if (!bVar20) {
            local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
            local_368._M_string_length = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            detail::JsonSetObject((json *)&local_368);
            detail::JsonAddMember(&local_2d8,"extensions",(json *)&local_368);
            detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_2a8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_368);
          }
          pbVar26 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2a8);
          bVar20 = detail::FindMember(pbVar26,"MSFT_lod",(json_iterator *)local_2a8);
          if (!bVar20) {
            local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
            local_368._M_string_length = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            detail::JsonSetObject((json *)&local_368);
            detail::JsonAddMember(pbVar26,"MSFT_lod",(json *)&local_368);
            detail::FindMember(pbVar26,"MSFT_lod",(json_iterator *)local_2a8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_368);
          }
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          local_368.field_2._M_local_buf[2] = 's';
          local_368.field_2._M_local_buf[0] = 'i';
          local_368.field_2._M_local_buf[1] = 'd';
          local_368._M_string_length = 3;
          local_368.field_2._M_local_buf[3] = '\0';
          pbVar26 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2a8);
          SerializeNumberArrayProperty<int>(&local_368,&pNVar32->lods,pbVar26);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
        }
LAB_001213ef:
        if ((pNVar32->name)._M_string_length != 0) {
          local_2a8[0x10] = 'n';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ = (pointer)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ = local_2a8 + 0x10;
          SerializeStringProperty((string *)local_2a8,&pNVar32->name,&local_2d8);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        local_2a8[0x10] = 'c';
        local_2a8[0x11] = 'h';
        local_2a8[0x12] = 'i';
        local_2a8[0x13] = 'l';
        local_2a8[0x14] = 'd';
        local_2a8[0x15] = 'r';
        local_2a8[0x16] = 'e';
        local_2a8[0x17] = 'n';
        local_2a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x8;
        auStack_290[0] = '\0';
        local_2a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_2a8 + 0x10);
        SerializeNumberArrayProperty<int>((string *)local_2a8,&pNVar32->children,&local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_);
        }
        if (local_2d8.m_type == null) {
          detail::JsonSetObject(&local_2d8);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_2f0,&local_2d8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_2d8);
        uVar27 = (ulong)uVar36;
        uVar24 = ((long)(local_320->nodes).
                        super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(local_320->nodes).
                        super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x4fbcda3ac10c9715;
        uVar36 = uVar36 + 1;
        model = local_320;
      } while (uVar27 <= uVar24 && uVar24 - uVar27 != 0);
    }
    detail::JsonAddMember(local_2f8,"nodes",(json *)&local_2f0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_2f0);
    model = local_320;
  }
  if (-1 < model->defaultScene) {
    local_2a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_2a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"scene","");
    SerializeNumberProperty<int>((string *)local_2a8,model->defaultScene,local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_);
    }
  }
  if ((model->scenes).super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->scenes).super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0;
    local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f0,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_2f0,true);
    if ((model->scenes).super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->scenes).super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar27 = 0;
      uVar24 = 1;
      do {
        local_2d8.m_type = null;
        local_2d8.m_value.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2d8,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_2d8,true);
        pSVar46 = (model->scenes).
                  super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_2a8[0x14] = 's';
        local_2a8[0x10] = 'n';
        local_2a8[0x11] = 'o';
        local_2a8[0x12] = 'd';
        local_2a8[0x13] = 'e';
        local_2a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x5;
        local_2a8[0x15] = '\0';
        local_2a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_2a8 + 0x10);
        SerializeNumberArrayProperty<int>((string *)local_2a8,&pSVar46[uVar27].nodes,&local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_);
        }
        pSVar46 = pSVar46 + uVar27;
        if ((pSVar46->name)._M_string_length != 0) {
          local_2a8[0x10] = 'n';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeStringProperty((string *)local_2a8,&pSVar46->name,&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        SerializeExtensionMap(&pSVar46->extensions,&local_2d8);
        SerializeExtras(&pSVar46->extras,&local_2d8);
        if (*(pointer *)
             &(pSVar46->audioEmitters).super__Vector_base<int,_std::allocator<int>_>._M_impl ==
            *(pointer *)
             ((long)&(pSVar46->audioEmitters).super__Vector_base<int,_std::allocator<int>_>._M_impl
             + 8)) {
          local_348._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_348._0_8_ = (pointer)0x0;
          local_348._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          pStack_330.m_it = -0x8000000000000000;
          bVar20 = detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_348);
          if (bVar20) {
            pbVar26 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_348);
            local_318.field_2._M_allocated_capacity = 0;
            local_318._M_dataplus._M_p = (pointer)0x0;
            local_318._M_string_length = 0;
            local_318.field_2._8_8_ = 0x8000000000000000;
            bVar20 = detail::FindMember(pbVar26,"KHR_audio",(json_iterator *)&local_318);
            if (bVar20) {
              local_2a8._0_8_ = local_318._M_dataplus._M_p;
              auStack_290[0] = (undefined1)local_318.field_2._8_8_;
              auStack_290[1] = (undefined1)((ulong)local_318.field_2._8_8_ >> 8);
              auStack_290[2] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x10);
              auStack_290[3] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x18);
              auStack_290[4] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x20);
              auStack_290[5] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x28);
              auStack_290[6] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x30);
              auStack_290[7] = (undefined1)((ulong)local_318.field_2._8_8_ >> 0x38);
              local_2a8._8_8_ = local_318._M_string_length;
              local_2a8[0x10] = (undefined1)local_318.field_2._M_allocated_capacity;
              local_2a8[0x11] = (undefined1)((ulong)local_318.field_2._0_8_ >> 8);
              local_2a8[0x12] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x10);
              local_2a8[0x13] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x18);
              local_2a8[0x14] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x20);
              local_2a8[0x15] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x28);
              local_2a8[0x16] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x30);
              local_2a8[0x17] = (undefined1)((ulong)local_318.field_2._0_8_ >> 0x38);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                        ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_368,pbVar26,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_2a8);
            }
            vVar5 = pbVar26->m_type;
            if (vVar5 != null) {
              if (vVar5 == object) {
                bVar20 = (((pbVar26->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                         _M_node_count == 0;
              }
              else {
                if (vVar5 != array) goto LAB_0012199d;
                bVar20 = (((pbVar26->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start ==
                         (((pbVar26->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              }
              if (!bVar20) goto LAB_0012199d;
            }
            local_2a8._0_8_ = local_348._0_8_;
            auStack_290[0] = (undefined1)pStack_330.m_it;
            auStack_290[1] = (undefined1)((ulong)pStack_330.m_it >> 8);
            auStack_290[2] = (undefined1)((ulong)pStack_330.m_it >> 0x10);
            auStack_290[3] = (undefined1)((ulong)pStack_330.m_it >> 0x18);
            auStack_290[4] = (undefined1)((ulong)pStack_330.m_it >> 0x20);
            auStack_290[5] = (undefined1)((ulong)pStack_330.m_it >> 0x28);
            auStack_290[6] = (undefined1)((ulong)pStack_330.m_it >> 0x30);
            auStack_290[7] = (undefined1)((ulong)pStack_330.m_it >> 0x38);
            local_2a8._8_8_ = local_348._8_8_;
            local_2a8[0x10] = (undefined1)local_348._16_8_;
            local_2a8[0x11] = SUB81(local_348._16_8_,1);
            local_2a8[0x12] = SUB81(local_348._16_8_,2);
            local_2a8[0x13] = SUB81(local_348._16_8_,3);
            local_2a8[0x14] = SUB81(local_348._16_8_,4);
            local_2a8[0x15] = SUB81(local_348._16_8_,5);
            local_2a8[0x16] = SUB81(local_348._16_8_,6);
            local_2a8[0x17] = SUB81(local_348._16_8_,7);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                      ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_368,&local_2d8,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_2a8);
          }
        }
        else {
          local_2a8[0x10] = '\0';
          local_2a8[0x11] = '\0';
          local_2a8[0x12] = '\0';
          local_2a8[0x13] = '\0';
          local_2a8[0x14] = '\0';
          local_2a8[0x15] = '\0';
          local_2a8[0x16] = '\0';
          local_2a8[0x17] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          auStack_290[0] = '\0';
          auStack_290[1] = '\0';
          auStack_290[2] = '\0';
          auStack_290[3] = '\0';
          auStack_290[4] = '\0';
          auStack_290[5] = '\0';
          auStack_290[6] = '\0';
          auStack_290[7] = -0x80;
          bVar20 = detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_2a8);
          if (!bVar20) {
            local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
            local_368._M_string_length = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            detail::JsonSetObject((json *)&local_368);
            detail::JsonAddMember(&local_2d8,"extensions",(json *)&local_368);
            detail::FindMember(&local_2d8,"extensions",(json_iterator *)local_2a8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_368);
          }
          pbVar26 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2a8);
          bVar20 = detail::FindMember(pbVar26,"KHR_audio",(json_iterator *)local_2a8);
          if (!bVar20) {
            local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
            local_368._M_string_length = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            detail::JsonSetObject((json *)&local_368);
            detail::JsonAddMember(pbVar26,"KHR_audio",(json *)&local_368);
            detail::FindMember(&local_2d8,"KHR_audio",(json_iterator *)local_2a8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_368);
          }
          local_368.field_2._M_local_buf[0] = 'e';
          local_368.field_2._M_local_buf[1] = 'm';
          local_368.field_2._M_local_buf[2] = 'i';
          local_368.field_2._M_local_buf[3] = 't';
          local_368.field_2._M_local_buf[4] = 't';
          local_368.field_2._M_local_buf[5] = 'e';
          local_368.field_2._M_local_buf[6] = 'r';
          local_368.field_2._M_local_buf[7] = 's';
          local_368._M_string_length = 8;
          local_368.field_2._M_local_buf[8] = '\0';
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          pbVar26 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_2a8);
          SerializeNumberArrayProperty<int>(&local_368,&pSVar46->audioEmitters,pbVar26);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
        }
LAB_0012199d:
        if (local_2d8.m_type == null) {
          detail::JsonSetObject(&local_2d8);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_2f0,&local_2d8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_2d8);
        uVar27 = ((long)(local_320->scenes).
                        super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_320->scenes).
                        super__Vector_base<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d;
        bVar20 = uVar24 <= uVar27;
        lVar48 = uVar27 - uVar24;
        model = local_320;
        uVar27 = uVar24;
        uVar24 = (ulong)((int)uVar24 + 1);
      } while (bVar20 && lVar48 != 0);
    }
    detail::JsonAddMember(local_2f8,"scenes",(json *)&local_2f0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_2f0);
    model = local_320;
  }
  if ((model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
    local_368._M_string_length = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    if ((model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar27 = 1;
      uVar24 = 0;
      do {
        uVar41 = uVar27;
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        pSVar47 = (model->skins).super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_2a8[0x14] = 't';
        local_2a8[0x15] = 's';
        local_2a8[0x10] = 'j';
        local_2a8[0x11] = 'o';
        local_2a8[0x12] = 'i';
        local_2a8[0x13] = 'n';
        local_2a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x6;
        local_2a8[0x16] = '\0';
        local_2a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_2a8 + 0x10);
        SerializeNumberArrayProperty<int>
                  ((string *)local_2a8,&pSVar47[uVar24].joints,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_);
        }
        pSVar47 = pSVar47 + uVar24;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
        if (-1 < pSVar47->inverseBindMatrices) {
          local_318._M_dataplus._M_p = (pointer)0x13;
          local_2a8._0_8_ = paVar2;
          local_2a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_2a8,(ulong)&local_318);
          local_2a8[0x10] = SUB81(local_318._M_dataplus._M_p,0);
          local_2a8[0x11] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 8);
          local_2a8[0x12] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x10);
          local_2a8[0x13] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x18);
          local_2a8[0x14] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x20);
          local_2a8[0x15] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x28);
          local_2a8[0x16] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x30);
          local_2a8[0x17] = (undefined1)((ulong)local_318._M_dataplus._M_p >> 0x38);
          *(undefined8 *)local_2a8._0_8_ = 0x4265737265766e69;
          *(char *)(local_2a8._0_8_ + 8) = 'i';
          *(char *)(local_2a8._0_8_ + 9) = 'n';
          *(char *)(local_2a8._0_8_ + 10) = 'd';
          *(char *)(local_2a8._0_8_ + 0xb) = 'M';
          *(char *)(local_2a8._0_8_ + 0xc) = 'a';
          *(char *)(local_2a8._0_8_ + 0xd) = 't';
          *(char *)(local_2a8._0_8_ + 0xe) = 'r';
          *(char *)(local_2a8._0_8_ + 0xf) = 'i';
          *(char *)(local_2a8._0_8_ + 0xf) = 'i';
          *(char *)(local_2a8._0_8_ + 0x10) = 'c';
          *(char *)(local_2a8._0_8_ + 0x11) = 'e';
          *(char *)(local_2a8._0_8_ + 0x12) = 's';
          local_2a8._8_8_ = local_318._M_dataplus._M_p;
          *(char *)(local_2a8._0_8_ + (long)local_318._M_dataplus._M_p) = '\0';
          SerializeNumberProperty<int>
                    ((string *)local_2a8,pSVar47->inverseBindMatrices,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ != paVar2) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (-1 < pSVar47->skeleton) {
          local_2a8[0x10] = 's';
          local_2a8[0x11] = 'k';
          local_2a8[0x12] = 'e';
          local_2a8[0x13] = 'l';
          local_2a8[0x14] = 'e';
          local_2a8[0x15] = 't';
          local_2a8[0x16] = 'o';
          local_2a8[0x17] = 'n';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x8;
          auStack_290[0] = '\0';
          local_2a8._0_8_ = paVar2;
          SerializeNumberProperty<int>
                    ((string *)local_2a8,pSVar47->skeleton,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ != paVar2) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if ((pSVar47->name)._M_string_length != 0) {
          local_2a8[0x10] = 'n';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ = paVar2;
          SerializeStringProperty
                    ((string *)local_2a8,&pSVar47->name,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ != paVar2) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        SerializeExtensionMap
                  (&pSVar47->extensions,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        SerializeExtras(&pSVar47->extras,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_368,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        uVar25 = ((long)(local_320->skins).
                        super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(local_320->skins).
                        super__Vector_base<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x7063e7063e7063e7;
        uVar27 = (ulong)((int)uVar41 + 1);
        uVar24 = uVar41;
        model = local_320;
      } while (uVar41 <= uVar25 && uVar25 - uVar41 != 0);
    }
    detail::JsonAddMember(local_2f8,"skins",(json *)&local_368);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_368);
    model = local_320;
  }
  if ((model->textures).super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->textures).super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
    local_368._M_string_length = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    if ((model->textures).super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->textures).super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar27 = 1;
      uVar24 = 0;
      do {
        uVar41 = uVar27;
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        pTVar12 = (model->textures).
                  super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
                  super__Vector_impl_data._M_start;
        value = pTVar12 + uVar24;
        if (-1 < pTVar12[uVar24].sampler) {
          local_2a8[0x14] = 'l';
          local_2a8[0x15] = 'e';
          local_2a8[0x16] = 'r';
          local_2a8[0x10] = 's';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'p';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x7;
          local_2a8[0x17] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<int>
                    ((string *)local_2a8,value->sampler,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (-1 < value->source) {
          local_2a8[0x14] = 'c';
          local_2a8[0x15] = 'e';
          local_2a8[0x10] = 's';
          local_2a8[0x11] = 'o';
          local_2a8[0x12] = 'u';
          local_2a8[0x13] = 'r';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x6;
          local_2a8[0x16] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<int>
                    ((string *)local_2a8,value->source,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if ((value->name)._M_string_length != 0) {
          local_2a8[0x10] = 'n';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeStringProperty
                    ((string *)local_2a8,&value->name,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        SerializeExtensionMap
                  (&value->extensions,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        SerializeExtras(&value->extras,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_368,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        uVar25 = ((long)(local_320->textures).
                        super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_320->textures).
                        super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5;
        uVar27 = (ulong)((int)uVar41 + 1);
        uVar24 = uVar41;
        model = local_320;
      } while (uVar41 <= uVar25 && uVar25 - uVar41 != 0);
    }
    detail::JsonAddMember(local_2f8,"textures",(json *)&local_368);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_368);
    model = local_320;
  }
  if ((model->samplers).super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->samplers).super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
    local_368._M_string_length = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    if ((model->samplers).super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->samplers).super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar27 = 1;
      uVar24 = 0;
      do {
        uVar41 = uVar27;
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        pSVar13 = (model->samplers).
                  super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>._M_impl.
                  super__Vector_impl_data._M_start;
        value_00 = pSVar13 + uVar24;
        if (pSVar13[uVar24].name._M_string_length != 0) {
          local_2a8[0x10] = 'n';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ = (pointer)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ = local_2a8 + 0x10;
          SerializeStringProperty
                    ((string *)local_2a8,&value_00->name,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (value_00->magFilter != -1) {
          local_2a8[0x10] = 'm';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'g';
          local_2a8[0x13] = 'F';
          local_2a8[0x14] = 'i';
          local_2a8[0x15] = 'l';
          local_2a8[0x16] = 't';
          local_2a8[0x17] = 'e';
          auStack_290[0] = 'r';
          local_2a8._8_8_ = (pointer)0x9;
          auStack_290[1] = '\0';
          local_2a8._0_8_ = local_2a8 + 0x10;
          SerializeNumberProperty<int>
                    ((string *)local_2a8,value_00->magFilter,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (value_00->minFilter != -1) {
          local_2a8[0x10] = 'm';
          local_2a8[0x11] = 'i';
          local_2a8[0x12] = 'n';
          local_2a8[0x13] = 'F';
          local_2a8[0x14] = 'i';
          local_2a8[0x15] = 'l';
          local_2a8[0x16] = 't';
          local_2a8[0x17] = 'e';
          auStack_290[0] = 'r';
          local_2a8._8_8_ = (pointer)0x9;
          auStack_290[1] = '\0';
          local_2a8._0_8_ = local_2a8 + 0x10;
          SerializeNumberProperty<int>
                    ((string *)local_2a8,value_00->minFilter,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        local_2a8[0x14] = 'S';
        local_2a8[0x10] = 'w';
        local_2a8[0x11] = 'r';
        local_2a8[0x12] = 'a';
        local_2a8[0x13] = 'p';
        local_2a8._8_8_ = (pointer)0x5;
        local_2a8[0x15] = '\0';
        local_2a8._0_8_ = local_2a8 + 0x10;
        SerializeNumberProperty<int>
                  ((string *)local_2a8,value_00->wrapS,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_);
        }
        local_2a8[0x14] = 'T';
        local_2a8[0x10] = 'w';
        local_2a8[0x11] = 'r';
        local_2a8[0x12] = 'a';
        local_2a8[0x13] = 'p';
        local_2a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x5;
        local_2a8[0x15] = '\0';
        local_2a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_2a8 + 0x10);
        SerializeNumberProperty<int>
                  ((string *)local_2a8,value_00->wrapT,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_);
        }
        SerializeExtensionMap
                  (&value_00->extensions,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        SerializeExtras(&value_00->extras,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_368,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        uVar25 = ((long)(local_320->samplers).
                        super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_320->samplers).
                        super__Vector_base<tinygltf::Sampler,_std::allocator<tinygltf::Sampler>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97;
        uVar27 = (ulong)((int)uVar41 + 1);
        uVar24 = uVar41;
        model = local_320;
      } while (uVar41 <= uVar25 && uVar25 - uVar41 != 0);
    }
    detail::JsonAddMember(local_2f8,"samplers",(json *)&local_368);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_368);
    model = local_320;
  }
  if ((model->cameras).super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->cameras).super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
    local_348._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_348,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_348,true);
    if ((model->cameras).super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->cameras).super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar27 = 0;
      uVar24 = 1;
      do {
        local_318._M_dataplus._M_p = local_318._M_dataplus._M_p & 0xffffffffffffff00;
        local_318._M_string_length = 0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&local_318,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&local_318,true);
        value_04 = (model->cameras).
                   super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar27;
        local_2a8[0x10] = 't';
        local_2a8[0x11] = 'y';
        local_2a8[0x12] = 'p';
        local_2a8[0x13] = 'e';
        local_2a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x4;
        local_2a8[0x14] = '\0';
        local_2a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_2a8 + 0x10);
        SerializeStringProperty((string *)local_2a8,&value_04->type,(json *)&local_318);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_);
        }
        if ((value_04->name)._M_string_length != 0) {
          local_2a8[0x10] = 'n';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeStringProperty((string *)local_2a8,&value_04->name,(json *)&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        iVar21 = std::__cxx11::string::compare((char *)value_04);
        if (iVar21 == 0) {
          local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
          local_368._M_string_length = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_368,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_368,true);
          local_2a8[0x10] = 'z';
          local_2a8[0x11] = 'f';
          local_2a8[0x12] = 'a';
          local_2a8[0x13] = 'r';
          local_2a8._8_8_ = (pointer)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ = local_2a8 + 0x10;
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(value_04->orthographic).zfar,(json *)&local_368);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
          local_2a8[0x14] = 'r';
          local_2a8[0x10] = 'z';
          local_2a8[0x11] = 'n';
          local_2a8[0x12] = 'e';
          local_2a8[0x13] = 'a';
          local_2a8._8_8_ = (pointer)0x5;
          local_2a8[0x15] = '\0';
          local_2a8._0_8_ = local_2a8 + 0x10;
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(value_04->orthographic).znear,(json *)&local_368);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
          local_2a8[0x10] = 'x';
          local_2a8[0x11] = 'm';
          local_2a8[0x12] = 'a';
          local_2a8[0x13] = 'g';
          local_2a8._8_8_ = (pointer)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ = local_2a8 + 0x10;
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(value_04->orthographic).xmag,(json *)&local_368);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
          local_2a8[0x10] = 'y';
          local_2a8[0x11] = 'm';
          local_2a8[0x12] = 'a';
          local_2a8[0x13] = 'g';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(value_04->orthographic).ymag,(json *)&local_368);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
          SerializeExtensionMap(&(value_04->orthographic).extensions,(json *)&local_368);
          SerializeExtras(&(value_04->orthographic).extras,(json *)&local_368);
          detail::JsonAddMember((json *)&local_318,"orthographic",(json *)&local_368);
LAB_00122709:
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_368);
        }
        else {
          iVar21 = std::__cxx11::string::compare((char *)value_04);
          if (iVar21 == 0) {
            local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
            local_368._M_string_length = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_368,true);
            local_2a8[0x10] = 'z';
            local_2a8[0x11] = 'f';
            local_2a8[0x12] = 'a';
            local_2a8[0x13] = 'r';
            local_2a8._8_8_ = (pointer)0x4;
            local_2a8[0x14] = '\0';
            local_2a8._0_8_ = local_2a8 + 0x10;
            SerializeNumberProperty<double>
                      ((string *)local_2a8,(value_04->perspective).zfar,(json *)&local_368);
            if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
              operator_delete((void *)local_2a8._0_8_);
            }
            local_2a8[0x14] = 'r';
            local_2a8[0x10] = 'z';
            local_2a8[0x11] = 'n';
            local_2a8[0x12] = 'e';
            local_2a8[0x13] = 'a';
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x5;
            local_2a8[0x15] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeNumberProperty<double>
                      ((string *)local_2a8,(value_04->perspective).znear,(json *)&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
            dVar4 = (value_04->perspective).aspectRatio;
            if (0.0 < dVar4) {
              local_2a8[0x10] = 'a';
              local_2a8[0x11] = 's';
              local_2a8[0x12] = 'p';
              local_2a8[0x13] = 'e';
              local_2a8[0x14] = 'c';
              local_2a8[0x15] = 't';
              local_2a8[0x16] = 'R';
              local_2a8[0x17] = 'a';
              auStack_290[0] = 't';
              auStack_290[1] = 'i';
              auStack_290[2] = 'o';
              local_2a8._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0xb;
              auStack_290[3] = '\0';
              local_2a8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_2a8 + 0x10);
              SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)&local_368);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_2a8 + 0x10)) {
                operator_delete((void *)local_2a8._0_8_);
              }
            }
            dVar4 = (value_04->perspective).yfov;
            if (0.0 < dVar4) {
              local_2a8[0x10] = 'y';
              local_2a8[0x11] = 'f';
              local_2a8[0x12] = 'o';
              local_2a8[0x13] = 'v';
              local_2a8._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x4;
              local_2a8[0x14] = '\0';
              local_2a8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_2a8 + 0x10);
              SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)&local_368);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_2a8 + 0x10)) {
                operator_delete((void *)local_2a8._0_8_);
              }
            }
            SerializeExtensionMap(&(value_04->perspective).extensions,(json *)&local_368);
            SerializeExtras(&(value_04->perspective).extras,(json *)&local_368);
            detail::JsonAddMember((json *)&local_318,"perspective",(json *)&local_368);
            goto LAB_00122709;
          }
        }
        SerializeExtensionMap(&value_04->extensions,(json *)&local_318);
        SerializeExtras(&value_04->extras,(json *)&local_318);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_318);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&local_318);
        uVar27 = ((long)(local_320->cameras).
                        super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_320->cameras).
                        super__Vector_base<tinygltf::Camera,_std::allocator<tinygltf::Camera>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2a4bafdc61f2a4bb;
        bVar20 = uVar24 <= uVar27;
        lVar48 = uVar27 - uVar24;
        uVar27 = uVar24;
        uVar24 = (ulong)((int)uVar24 + 1);
        model = local_320;
      } while (bVar20 && lVar48 != 0);
    }
    detail::JsonAddMember(local_2f8,"cameras",(json *)local_348);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_348);
    model = local_320;
  }
  SerializeExtensionMap(&model->extensions,local_2f8);
  SerializeExtras(&model->extras,local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_2f0,&model->extensionsUsed);
  if ((model->lights).super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->lights).super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
    local_348._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    uVar36 = 1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_348,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_348,true);
    if ((model->lights).super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->lights).super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar27 = 0;
      do {
        local_318._M_dataplus._M_p = local_318._M_dataplus._M_p & 0xffffffffffffff00;
        local_318._M_string_length = 0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&local_318,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&local_318,true);
        pLVar14 = (model->lights).
                  super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>._M_impl.
                  super__Vector_impl_data._M_start;
        value_01 = pLVar14 + uVar27;
        if (pLVar14[uVar27].name._M_string_length != 0) {
          local_2a8[0x10] = 'n';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ = (pointer)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ = local_2a8 + 0x10;
          SerializeStringProperty((string *)local_2a8,&value_01->name,(json *)&local_318);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        local_2a8[0x10] = 'i';
        local_2a8[0x11] = 'n';
        local_2a8[0x12] = 't';
        local_2a8[0x13] = 'e';
        local_2a8[0x14] = 'n';
        local_2a8[0x15] = 's';
        local_2a8[0x16] = 'i';
        local_2a8[0x17] = 't';
        auStack_290[0] = 'y';
        local_2a8._8_8_ = (pointer)0x9;
        auStack_290[1] = '\0';
        local_2a8._0_8_ = local_2a8 + 0x10;
        SerializeNumberProperty<double>((string *)local_2a8,value_01->intensity,(json *)&local_318);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_);
        }
        if (0.0 < value_01->range) {
          local_2a8[0x14] = 'e';
          local_2a8[0x10] = 'r';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'n';
          local_2a8[0x13] = 'g';
          local_2a8._8_8_ = (pointer)0x5;
          local_2a8[0x15] = '\0';
          local_2a8._0_8_ = local_2a8 + 0x10;
          SerializeNumberProperty<double>((string *)local_2a8,value_01->range,(json *)&local_318);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        local_2a8[0x14] = 'r';
        local_2a8[0x10] = 'c';
        local_2a8[0x11] = 'o';
        local_2a8[0x12] = 'l';
        local_2a8[0x13] = 'o';
        local_2a8._8_8_ = (pointer)0x5;
        local_2a8[0x15] = '\0';
        local_2a8._0_8_ = local_2a8 + 0x10;
        SerializeNumberArrayProperty<double>
                  ((string *)local_2a8,&value_01->color,(json *)&local_318);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_);
        }
        local_2a8[0x10] = 't';
        local_2a8[0x11] = 'y';
        local_2a8[0x12] = 'p';
        local_2a8[0x13] = 'e';
        local_2a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x4;
        local_2a8[0x14] = '\0';
        local_2a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_2a8 + 0x10);
        SerializeStringProperty((string *)local_2a8,&value_01->type,(json *)&local_318);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_);
        }
        iVar21 = std::__cxx11::string::compare((char *)&value_01->type);
        if (iVar21 == 0) {
          local_68 = (ExtensionMap *)CONCAT44(local_68._4_4_,uVar36);
          local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
          local_368._M_string_length = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_368,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_368,true);
          auStack_290[0] = 'e';
          auStack_290[1] = 'A';
          auStack_290[2] = 'n';
          auStack_290[3] = 'g';
          auStack_290[4] = 'l';
          auStack_290[5] = 'e';
          local_2a8[0x10] = 'i';
          local_2a8[0x11] = 'n';
          local_2a8[0x12] = 'n';
          local_2a8[0x13] = 'e';
          local_2a8[0x14] = 'r';
          local_2a8[0x15] = 'C';
          local_2a8[0x16] = 'o';
          local_2a8[0x17] = 'n';
          local_2a8._8_8_ = (pointer)0xe;
          auStack_290[6] = '\0';
          local_2a8._0_8_ = local_2a8 + 0x10;
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(value_01->spot).innerConeAngle,(json *)&local_368);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
          auStack_290[0] = 'e';
          auStack_290[1] = 'A';
          auStack_290[2] = 'n';
          auStack_290[3] = 'g';
          auStack_290[4] = 'l';
          auStack_290[5] = 'e';
          local_2a8[0x10] = 'o';
          local_2a8[0x11] = 'u';
          local_2a8[0x12] = 't';
          local_2a8[0x13] = 'e';
          local_2a8[0x14] = 'r';
          local_2a8[0x15] = 'C';
          local_2a8[0x16] = 'o';
          local_2a8[0x17] = 'n';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xe;
          auStack_290[6] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<double>
                    ((string *)local_2a8,(value_01->spot).outerConeAngle,(json *)&local_368);
          uVar36 = (uint)local_68;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
          SerializeExtensionMap(&(value_01->spot).extensions,(json *)&local_368);
          SerializeExtras(&(value_01->spot).extras,(json *)&local_368);
          detail::JsonAddMember((json *)&local_318,"spot",(json *)&local_368);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_368);
        }
        SerializeExtensionMap(&value_01->extensions,(json *)&local_318);
        SerializeExtras(&value_01->extras,(json *)&local_318);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_318);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&local_318);
        uVar27 = (ulong)uVar36;
        uVar24 = ((long)(local_320->lights).
                        super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_320->lights).
                        super__Vector_base<tinygltf::Light,_std::allocator<tinygltf::Light>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2c3f35ba781948b1;
        uVar36 = uVar36 + 1;
        model = local_320;
      } while (uVar27 <= uVar24 && uVar24 - uVar27 != 0);
    }
    local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
    local_368._M_string_length = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    detail::JsonAddMember((json *)&local_368,"lights",(json *)local_348);
    local_318._M_dataplus._M_p = local_318._M_dataplus._M_p & 0xffffffffffffff00;
    local_318._M_string_length = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_318,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_318,true);
    local_2a8[0x10] = '\0';
    local_2a8[0x11] = '\0';
    local_2a8[0x12] = '\0';
    local_2a8[0x13] = '\0';
    local_2a8[0x14] = '\0';
    local_2a8[0x15] = '\0';
    local_2a8[0x16] = '\0';
    local_2a8[0x17] = '\0';
    local_2a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_2a8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    auStack_290[0] = '\0';
    auStack_290[1] = '\0';
    auStack_290[2] = '\0';
    auStack_290[3] = '\0';
    auStack_290[4] = '\0';
    auStack_290[5] = '\0';
    auStack_290[6] = '\0';
    auStack_290[7] = -0x80;
    bVar20 = detail::FindMember(local_2f8,"extensions",(json_const_iterator *)local_2a8);
    if (bVar20) {
      pbVar29 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_2a8);
      detail::JsonAssign((json *)&local_318,pbVar29);
    }
    detail::JsonAddMember((json *)&local_318,"KHR_lights_punctual",(json *)&local_368);
    detail::JsonAddMember(local_2f8,"extensions",(json *)&local_318);
    pdVar19 = local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    jVar38.number_integer._1_7_ =
         local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._1_7_;
    jVar38.boolean =
         (boolean_t)
         local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._0_1_;
    lVar48 = (long)local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)jVar38 >> 7;
    if (0 < lVar48) {
      lVar48 = lVar48 + 1;
      do {
        iVar21 = std::__cxx11::string::compare((char *)jVar38.object);
        jVar39 = jVar38;
        if (iVar21 == 0) goto LAB_00122dd0;
        iVar21 = std::__cxx11::string::compare(&(jVar38.binary)->m_has_subtype);
        jVar39 = (json_value)&(jVar38.binary)->m_has_subtype;
        if (iVar21 == 0) goto LAB_00122dd0;
        iVar21 = std::__cxx11::string::compare((char *)(jVar38.number_integer + 0x40));
        jVar39.object = (object_t *)(jVar38.number_integer + 0x40);
        if (iVar21 == 0) goto LAB_00122dd0;
        iVar21 = std::__cxx11::string::compare((char *)(jVar38.number_integer + 0x60));
        jVar39.object = (object_t *)(jVar38.number_integer + 0x60);
        if (iVar21 == 0) goto LAB_00122dd0;
        jVar38.object = (object_t *)(jVar38.number_integer + 0x80);
        lVar48 = lVar48 + -1;
      } while (1 < lVar48);
    }
    lVar48 = (long)pdVar19 - (long)jVar38 >> 5;
    if (lVar48 == 1) {
LAB_00122db3:
      iVar21 = std::__cxx11::string::compare((char *)jVar38.object);
      jVar39 = (json_value)pdVar19;
      if (iVar21 == 0) {
        jVar39 = jVar38;
      }
    }
    else if (lVar48 == 2) {
LAB_00122d9c:
      iVar21 = std::__cxx11::string::compare((char *)jVar38.object);
      jVar39 = jVar38;
      if (iVar21 != 0) {
        jVar38.object = (object_t *)&(jVar38.binary)->m_has_subtype;
        goto LAB_00122db3;
      }
    }
    else {
      jVar39 = (json_value)pdVar19;
      if ((lVar48 == 3) &&
         (iVar21 = std::__cxx11::string::compare((char *)jVar38.object), jVar39 = jVar38,
         iVar21 != 0)) {
        jVar38.object =
             (object_t *)&((jVar38.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
        goto LAB_00122d9c;
      }
    }
LAB_00122dd0:
    model = local_320;
    if (jVar39.object ==
        (object_t *)
        local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_2a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_2a8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"KHR_lights_punctual","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_2a8 + 0x10)) {
        operator_delete((void *)local_2a8._0_8_);
      }
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_318);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_368);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_348);
  }
  if (((model->audioEmitters).
       super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (model->audioEmitters).
       super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((model->audioSources).
      super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (model->audioSources).
      super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_2d8.m_type = null;
    local_2d8.m_value.object = (object_t *)0x0;
    uVar36 = 1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2d8,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2d8,true);
    if ((model->audioEmitters).
        super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (model->audioEmitters).
        super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar27 = 0;
      do {
        local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
        local_348._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_348,true);
        pAVar15 = (model->audioEmitters).
                  super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        value_02 = pAVar15 + uVar27;
        if (pAVar15[uVar27].name._M_string_length != 0) {
          local_2a8[0x10] = 'n';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'm';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeStringProperty
                    ((string *)local_2a8,&value_02->name,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (1e-12 <= ABS(1.0 - value_02->gain)) {
          local_2a8[0x10] = 'g';
          local_2a8[0x11] = 'a';
          local_2a8[0x12] = 'i';
          local_2a8[0x13] = 'n';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<double>
                    ((string *)local_2a8,value_02->gain,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (value_02->loop == true) {
          local_2a8[0x10] = 'l';
          local_2a8[0x11] = 'o';
          local_2a8[0x12] = 'o';
          local_2a8[0x13] = 'p';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<bool>
                    ((string *)local_2a8,value_02->loop,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if (value_02->playing == true) {
          local_2a8[0x14] = 'i';
          local_2a8[0x15] = 'n';
          local_2a8[0x16] = 'g';
          local_2a8[0x10] = 'p';
          local_2a8[0x11] = 'l';
          local_2a8[0x12] = 'a';
          local_2a8[0x13] = 'y';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x7;
          local_2a8[0x17] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeNumberProperty<bool>
                    ((string *)local_2a8,value_02->playing,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if ((value_02->type)._M_string_length != 0) {
          local_2a8[0x10] = 't';
          local_2a8[0x11] = 'y';
          local_2a8[0x12] = 'p';
          local_2a8[0x13] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4;
          local_2a8[0x14] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeStringProperty
                    ((string *)local_2a8,&value_02->type,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        if ((value_02->distanceModel)._M_string_length != 0) {
          auStack_290[0] = 'M';
          auStack_290[1] = 'o';
          auStack_290[2] = 'd';
          auStack_290[3] = 'e';
          auStack_290[4] = 'l';
          local_2a8[0x10] = 'd';
          local_2a8[0x11] = 'i';
          local_2a8[0x12] = 's';
          local_2a8[0x13] = 't';
          local_2a8[0x14] = 'a';
          local_2a8[0x15] = 'n';
          local_2a8[0x16] = 'c';
          local_2a8[0x17] = 'e';
          local_2a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xd;
          auStack_290[5] = '\0';
          local_2a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2a8 + 0x10);
          SerializeStringProperty
                    ((string *)local_2a8,&value_02->distanceModel,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
        iVar21 = std::__cxx11::string::compare((char *)&value_02->type);
        if (iVar21 == 0) {
          local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
          local_368._M_string_length = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_368,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_368,true);
          dVar4 = (value_02->positional).coneInnerAngle;
          if (1e-12 <= ABS(6.283185307179586 - dVar4)) {
            auStack_290[0] = 'r';
            auStack_290[1] = 'A';
            auStack_290[2] = 'n';
            auStack_290[3] = 'g';
            auStack_290[4] = 'l';
            auStack_290[5] = 'e';
            local_2a8[0x10] = 'c';
            local_2a8[0x11] = 'o';
            local_2a8[0x12] = 'n';
            local_2a8[0x13] = 'e';
            local_2a8[0x14] = 'I';
            local_2a8[0x15] = 'n';
            local_2a8[0x16] = 'n';
            local_2a8[0x17] = 'e';
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xe;
            auStack_290[6] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
          }
          dVar4 = (value_02->positional).coneOuterAngle;
          if (1e-12 <= ABS(6.283185307179586 - dVar4)) {
            auStack_290[0] = 'r';
            auStack_290[1] = 'A';
            auStack_290[2] = 'n';
            auStack_290[3] = 'g';
            auStack_290[4] = 'l';
            auStack_290[5] = 'e';
            local_2a8[0x10] = 'c';
            local_2a8[0x11] = 'o';
            local_2a8[0x12] = 'n';
            local_2a8[0x13] = 'e';
            local_2a8[0x14] = 'O';
            local_2a8[0x15] = 'u';
            local_2a8[0x16] = 't';
            local_2a8[0x17] = 'e';
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xe;
            auStack_290[6] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
          }
          dVar4 = (value_02->positional).coneOuterGain;
          if (0.0 < dVar4) {
            auStack_290[0] = 'r';
            auStack_290[1] = 'G';
            auStack_290[2] = 'a';
            auStack_290[3] = 'i';
            auStack_290[4] = 'n';
            local_2a8[0x10] = 'c';
            local_2a8[0x11] = 'o';
            local_2a8[0x12] = 'n';
            local_2a8[0x13] = 'e';
            local_2a8[0x14] = 'O';
            local_2a8[0x15] = 'u';
            local_2a8[0x16] = 't';
            local_2a8[0x17] = 'e';
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xd;
            auStack_290[5] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
          }
          dVar4 = (value_02->positional).maxDistance;
          if (1e-12 <= ABS(100.0 - dVar4)) {
            local_2a8[0x10] = 'm';
            local_2a8[0x11] = 'a';
            local_2a8[0x12] = 'x';
            local_2a8[0x13] = 'D';
            local_2a8[0x14] = 'i';
            local_2a8[0x15] = 's';
            local_2a8[0x16] = 't';
            local_2a8[0x17] = 'a';
            auStack_290[0] = 'n';
            auStack_290[1] = 'c';
            auStack_290[2] = 'e';
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xb;
            auStack_290[3] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
          }
          dVar4 = (value_02->positional).refDistance;
          if (1e-12 <= ABS(1.0 - dVar4)) {
            local_2a8[0x10] = 'r';
            local_2a8[0x11] = 'e';
            local_2a8[0x12] = 'f';
            local_2a8[0x13] = 'D';
            local_2a8[0x14] = 'i';
            local_2a8[0x15] = 's';
            local_2a8[0x16] = 't';
            local_2a8[0x17] = 'a';
            auStack_290[0] = 'n';
            auStack_290[1] = 'c';
            auStack_290[2] = 'e';
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xb;
            auStack_290[3] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
          }
          dVar4 = (value_02->positional).rolloffFactor;
          if (1e-12 <= ABS(1.0 - dVar4)) {
            auStack_290[0] = 'a';
            auStack_290[1] = 'c';
            auStack_290[2] = 't';
            auStack_290[3] = 'o';
            auStack_290[4] = 'r';
            local_2a8[0x10] = 'r';
            local_2a8[0x11] = 'o';
            local_2a8[0x12] = 'l';
            local_2a8[0x13] = 'l';
            local_2a8[0x14] = 'o';
            local_2a8[0x15] = 'f';
            local_2a8[0x16] = 'f';
            local_2a8[0x17] = 'F';
            local_2a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xd;
            auStack_290[5] = '\0';
            local_2a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2a8 + 0x10);
            SerializeNumberProperty<double>((string *)local_2a8,dVar4,(json *)&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_);
            }
          }
          SerializeExtensionMap(&(value_02->positional).extensions,(json *)&local_368);
          SerializeExtras(&(value_02->positional).extras,(json *)&local_368);
          detail::JsonAddMember
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_348,"positional",(json *)&local_368);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_368);
        }
        local_2a8[0x14] = 'c';
        local_2a8[0x15] = 'e';
        local_2a8[0x10] = 's';
        local_2a8[0x11] = 'o';
        local_2a8[0x12] = 'u';
        local_2a8[0x13] = 'r';
        local_2a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x6;
        local_2a8[0x16] = '\0';
        local_2a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_2a8 + 0x10);
        SerializeNumberProperty<int>
                  ((string *)local_2a8,value_02->source,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_);
        }
        SerializeExtensionMap
                  (&value_02->extensions,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_348);
        SerializeExtras(&value_02->extras,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back(&local_2d8,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_348);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_348);
        uVar27 = (ulong)uVar36;
        uVar24 = ((long)(local_320->audioEmitters).
                        super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_320->audioEmitters).
                        super__Vector_base<tinygltf::AudioEmitter,_std::allocator<tinygltf::AudioEmitter>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x66fd0eb66fd0eb67;
        uVar36 = uVar36 + 1;
        model = local_320;
      } while (uVar27 <= uVar24 && uVar24 - uVar27 != 0);
    }
    local_2c8.m_type = null;
    local_2c8.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2c8,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_2c8,true);
    detail::JsonAddMember(&local_2c8,"emitters",&local_2d8);
    local_58.m_type = null;
    local_58.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_58,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(&local_58,true);
    if ((local_320->audioSources).
        super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (local_320->audioSources).
        super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>._M_impl.
        super__Vector_impl_data._M_start) {
      paVar2 = &local_318.field_2;
      uVar27 = 0;
      uVar24 = 1;
      do {
        pMVar18 = local_320;
        local_40.m_type = null;
        local_40.m_value.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_40,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_40,true);
        pAVar16 = (pMVar18->audioSources).
                  super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        value_03 = pAVar16 + uVar27;
        local_2a8._0_8_ = local_2a8 + 0x10;
        local_2a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_2a8[0x10] = '\0';
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        local_368._M_string_length = 0;
        local_368.field_2._M_local_buf[0] = '\0';
        local_348._0_8_ = local_348 + 0x10;
        local_348._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_348._16_8_ = local_348._16_8_ & 0xffffffffffffff00;
        if (pAVar16[uVar27].name._M_string_length != 0) {
          local_318._M_string_length = 4;
          local_318.field_2._M_allocated_capacity._0_5_ = 0x656d616e;
          local_318._M_dataplus._M_p = (pointer)paVar2;
          SerializeStringProperty(&local_318,&value_03->name,&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != paVar2) {
            operator_delete(local_318._M_dataplus._M_p);
          }
        }
        if ((value_03->uri)._M_string_length == 0) {
          local_318.field_2._M_allocated_capacity = 0x65707954656d696d;
          local_318._M_string_length = 8;
          local_318.field_2._8_8_ = local_318.field_2._8_8_ & 0xffffffffffffff00;
          local_318._M_dataplus._M_p = (pointer)paVar2;
          SerializeStringProperty(&local_318,&value_03->mimeType,&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != paVar2) {
            operator_delete(local_318._M_dataplus._M_p);
          }
          local_318.field_2._M_allocated_capacity = 0x6956726566667562;
          local_318._M_string_length = 10;
          local_318.field_2._8_3_ = 0x7765;
          local_318._M_dataplus._M_p = (pointer)paVar2;
          SerializeNumberProperty<int>(&local_318,value_03->bufferView,&local_40);
        }
        else {
          local_318._M_string_length = 3;
          local_318.field_2._M_allocated_capacity._0_4_ = 0x697275;
          local_318._M_dataplus._M_p = (pointer)paVar2;
          SerializeStringProperty(&local_318,&value_03->uri,&local_40);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != paVar2) {
          operator_delete(local_318._M_dataplus._M_p);
        }
        SerializeExtensionMap(&value_03->extensions,&local_40);
        SerializeExtras(&value_03->extras,&local_40);
        if ((pointer)local_348._0_8_ != (pointer)(local_348 + 0x10)) {
          operator_delete((void *)local_348._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p);
        }
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back(&local_58,&local_40);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_40);
        uVar27 = ((long)(local_320->audioSources).
                        super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_320->audioSources).
                        super__Vector_base<tinygltf::AudioSource,_std::allocator<tinygltf::AudioSource>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x2c8590b21642c859;
        bVar20 = uVar24 <= uVar27;
        lVar48 = uVar27 - uVar24;
        uVar27 = uVar24;
        uVar24 = (ulong)((int)uVar24 + 1);
      } while (bVar20 && lVar48 != 0);
    }
    detail::JsonAddMember(&local_2c8,"sources",&local_58);
    local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffffffffff00;
    local_368._M_string_length = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_368,true);
    local_2a8[0x10] = '\0';
    local_2a8[0x11] = '\0';
    local_2a8[0x12] = '\0';
    local_2a8[0x13] = '\0';
    local_2a8[0x14] = '\0';
    local_2a8[0x15] = '\0';
    local_2a8[0x16] = '\0';
    local_2a8[0x17] = '\0';
    local_2a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_2a8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    auStack_290[0] = '\0';
    auStack_290[1] = '\0';
    auStack_290[2] = '\0';
    auStack_290[3] = '\0';
    auStack_290[4] = '\0';
    auStack_290[5] = '\0';
    auStack_290[6] = '\0';
    auStack_290[7] = -0x80;
    bVar20 = detail::FindMember(local_2f8,"extensions",(json_const_iterator *)local_2a8);
    if (bVar20) {
      pbVar29 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_2a8);
      detail::JsonAssign((json *)&local_368,pbVar29);
    }
    detail::JsonAddMember((json *)&local_368,"KHR_audio",&local_2c8);
    detail::JsonAddMember(local_2f8,"extensions",(json *)&local_368);
    pdVar19 = local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    jVar39.number_integer._1_7_ =
         local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._1_7_;
    jVar39.boolean =
         (boolean_t)
         local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._0_1_;
    lVar48 = (long)local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)jVar39 >> 7;
    if (0 < lVar48) {
      lVar48 = lVar48 + 1;
      do {
        iVar21 = std::__cxx11::string::compare((char *)jVar39.object);
        jVar38 = jVar39;
        if (iVar21 == 0) goto LAB_001239f6;
        iVar21 = std::__cxx11::string::compare(&(jVar39.binary)->m_has_subtype);
        jVar38 = (json_value)&(jVar39.binary)->m_has_subtype;
        if (iVar21 == 0) goto LAB_001239f6;
        iVar21 = std::__cxx11::string::compare((char *)(jVar39.number_integer + 0x40));
        jVar38.object = (object_t *)(jVar39.number_integer + 0x40);
        if (iVar21 == 0) goto LAB_001239f6;
        iVar21 = std::__cxx11::string::compare((char *)(jVar39.number_integer + 0x60));
        jVar38.object = (object_t *)(jVar39.number_integer + 0x60);
        if (iVar21 == 0) goto LAB_001239f6;
        jVar39.object = (object_t *)(jVar39.number_integer + 0x80);
        lVar48 = lVar48 + -1;
      } while (1 < lVar48);
    }
    lVar48 = (long)pdVar19 - (long)jVar39 >> 5;
    if (lVar48 == 1) {
LAB_001239d9:
      iVar21 = std::__cxx11::string::compare((char *)jVar39.object);
      jVar38 = (json_value)pdVar19;
      if (iVar21 == 0) {
        jVar38 = jVar39;
      }
    }
    else if (lVar48 == 2) {
LAB_001239c2:
      iVar21 = std::__cxx11::string::compare((char *)jVar39.object);
      jVar38 = jVar39;
      if (iVar21 != 0) {
        jVar39.object = (object_t *)&(jVar39.binary)->m_has_subtype;
        goto LAB_001239d9;
      }
    }
    else {
      jVar38 = (json_value)pdVar19;
      if ((lVar48 == 3) &&
         (iVar21 = std::__cxx11::string::compare((char *)jVar39.object), jVar38 = jVar39,
         iVar21 != 0)) {
        jVar39.object =
             (object_t *)&((jVar39.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
        goto LAB_001239c2;
      }
    }
LAB_001239f6:
    model = local_320;
    if (jVar38.object ==
        (object_t *)
        local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_2a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_2a8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"KHR_audio","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_2a8 + 0x10)) {
        operator_delete((void *)local_2a8._0_8_);
      }
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_368);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_58);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_2c8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_2d8);
  }
  pdVar19 = local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pNVar32 = (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pNVar17 = (model->nodes).super__Vector_base<tinygltf::Node,_std::allocator<tinygltf::Node>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar48 = ((long)pNVar17 - (long)pNVar32 >> 3) * 0x4fbcda3ac10c9715 >> 2;
  pNVar35 = pNVar32;
  if (0 < lVar48) {
    pNVar35 = pNVar32 + lVar48 * 4;
    lVar48 = lVar48 + 1;
    pNVar32 = pNVar32 + 2;
    do {
      if (pNVar32[-2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pNVar32[-2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pNVar32 = pNVar32 + -2;
        goto LAB_00123b9a;
      }
      if (pNVar32[-1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pNVar32[-1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pNVar32 = pNVar32 + -1;
        goto LAB_00123b9a;
      }
      if ((pNVar32->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pNVar32->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00123b9a;
      if (pNVar32[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pNVar32[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pNVar32 = pNVar32 + 1;
        goto LAB_00123b9a;
      }
      lVar48 = lVar48 + -1;
      pNVar32 = pNVar32 + 4;
    } while (1 < lVar48);
  }
  lVar48 = ((long)pNVar17 - (long)pNVar35 >> 3) * 0x4fbcda3ac10c9715;
  if (lVar48 == 1) {
LAB_00123b70:
    pNVar32 = pNVar35;
    if ((pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar32 = pNVar17;
    }
  }
  else if (lVar48 == 2) {
LAB_00123b5f:
    pNVar32 = pNVar35;
    if ((pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar35 = pNVar35 + 1;
      goto LAB_00123b70;
    }
  }
  else {
    pNVar32 = pNVar17;
    if ((lVar48 == 3) &&
       (pNVar32 = pNVar35,
       (pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start ==
       (pNVar35->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish)) {
      pNVar35 = pNVar35 + 1;
      goto LAB_00123b5f;
    }
  }
LAB_00123b9a:
  pMVar44 = (model->materials).
            super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar10 = (model->materials).
            super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar48 = ((long)pMVar10 - (long)pMVar44 >> 3) * -0x2a825c935d853211 >> 2;
  pMVar42 = pMVar44;
  if (0 < lVar48) {
    pMVar42 = pMVar44 + lVar48 * 4;
    lVar48 = lVar48 + 1;
    pMVar44 = pMVar44 + 2;
    do {
      if (pMVar44[-2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pMVar44[-2].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pMVar44 = pMVar44 + -2;
        goto LAB_00123cb0;
      }
      if (pMVar44[-1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pMVar44[-1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pMVar44 = pMVar44 + -1;
        goto LAB_00123cb0;
      }
      if ((pMVar44->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pMVar44->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00123cb0;
      if (pMVar44[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pMVar44[1].lods.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pMVar44 = pMVar44 + 1;
        goto LAB_00123cb0;
      }
      lVar48 = lVar48 + -1;
      pMVar44 = pMVar44 + 4;
    } while (1 < lVar48);
  }
  lVar48 = ((long)pMVar10 - (long)pMVar42 >> 3) * -0x2a825c935d853211;
  if (lVar48 == 1) {
LAB_00123c86:
    pMVar44 = pMVar42;
    if ((pMVar42->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pMVar42->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar44 = pMVar10;
    }
  }
  else if (lVar48 == 2) {
LAB_00123c75:
    pMVar44 = pMVar42;
    if ((pMVar42->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pMVar42->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar42 = pMVar42 + 1;
      goto LAB_00123c86;
    }
  }
  else {
    pMVar44 = pMVar10;
    if ((lVar48 == 3) &&
       (pMVar44 = pMVar42,
       (pMVar42->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start ==
       (pMVar42->lods).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish)) {
      pMVar42 = pMVar42 + 1;
      goto LAB_00123c75;
    }
  }
LAB_00123cb0:
  if ((pNVar32 == pNVar17) && (pMVar44 == pMVar10)) goto LAB_00123e00;
  jVar40.number_integer._1_7_ =
       local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start._1_7_;
  jVar40.boolean =
       (boolean_t)
       local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start._0_1_;
  lVar48 = (long)local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)jVar40 >> 7;
  if (0 < lVar48) {
    lVar48 = lVar48 + 1;
    do {
      iVar21 = std::__cxx11::string::compare((char *)jVar40.object);
      jVar38 = jVar40;
      if (iVar21 == 0) goto LAB_00123dac;
      iVar21 = std::__cxx11::string::compare(&(jVar40.binary)->m_has_subtype);
      jVar38 = (json_value)&(jVar40.binary)->m_has_subtype;
      if (iVar21 == 0) goto LAB_00123dac;
      iVar21 = std::__cxx11::string::compare((char *)(jVar40.number_integer + 0x40));
      jVar38.object = (object_t *)(jVar40.number_integer + 0x40);
      if (iVar21 == 0) goto LAB_00123dac;
      iVar21 = std::__cxx11::string::compare((char *)(jVar40.number_integer + 0x60));
      jVar38.object = (object_t *)(jVar40.number_integer + 0x60);
      if (iVar21 == 0) goto LAB_00123dac;
      jVar40.object = (object_t *)(jVar40.number_integer + 0x80);
      lVar48 = lVar48 + -1;
    } while (1 < lVar48);
  }
  lVar48 = (long)pdVar19 - (long)jVar40 >> 5;
  if (lVar48 == 1) {
LAB_00123d8f:
    iVar21 = std::__cxx11::string::compare((char *)jVar40.object);
    jVar38 = (json_value)pdVar19;
    if (iVar21 == 0) {
      jVar38 = jVar40;
    }
  }
  else if (lVar48 == 2) {
LAB_00123d78:
    iVar21 = std::__cxx11::string::compare((char *)jVar40.object);
    jVar38 = jVar40;
    if (iVar21 != 0) {
      jVar40.object = (object_t *)&(jVar40.binary)->m_has_subtype;
      goto LAB_00123d8f;
    }
  }
  else {
    jVar38 = (json_value)pdVar19;
    if ((lVar48 == 3) &&
       (iVar21 = std::__cxx11::string::compare((char *)jVar40.object), jVar38 = jVar40, iVar21 != 0)
       ) {
      jVar40.object =
           (object_t *)&((jVar40.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
      goto LAB_00123d78;
    }
  }
LAB_00123dac:
  if (jVar38.object ==
      (object_t *)
      local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_2a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_2a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"MSFT_lod","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_);
    }
  }
LAB_00123e00:
  if ((object_t *)
      local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (object_t *)
      CONCAT71(local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start._1_7_,
               local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start._0_1_)) {
    local_2a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_2a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"extensionsUsed","");
    SerializeStringArrayProperty
              ((string *)local_2a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2f0,local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2f0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2b8);
  return;
}

Assistant:

static void SerializeGltfModel(const Model *model, detail::json &o) {
  // ACCESSORS
  if (model->accessors.size()) {
    detail::json accessors;
    detail::JsonReserveArray(accessors, model->accessors.size());
    for (unsigned int i = 0; i < model->accessors.size(); ++i) {
      detail::json accessor;
      SerializeGltfAccessor(model->accessors[i], accessor);
      detail::JsonPushBack(accessors, std::move(accessor));
    }
    detail::JsonAddMember(o, "accessors", std::move(accessors));
  }

  // ANIMATIONS
  if (model->animations.size()) {
    detail::json animations;
    detail::JsonReserveArray(animations, model->animations.size());
    for (unsigned int i = 0; i < model->animations.size(); ++i) {
      if (model->animations[i].channels.size()) {
        detail::json animation;
        SerializeGltfAnimation(model->animations[i], animation);
        detail::JsonPushBack(animations, std::move(animation));
      }
    }

    detail::JsonAddMember(o, "animations", std::move(animations));
  }

  // ASSET
  detail::json asset;
  SerializeGltfAsset(model->asset, asset);
  detail::JsonAddMember(o, "asset", std::move(asset));

  // BUFFERVIEWS
  if (model->bufferViews.size()) {
    detail::json bufferViews;
    detail::JsonReserveArray(bufferViews, model->bufferViews.size());
    for (unsigned int i = 0; i < model->bufferViews.size(); ++i) {
      detail::json bufferView;
      SerializeGltfBufferView(model->bufferViews[i], bufferView);
      detail::JsonPushBack(bufferViews, std::move(bufferView));
    }
    detail::JsonAddMember(o, "bufferViews", std::move(bufferViews));
  }

  // Extensions required
  if (model->extensionsRequired.size()) {
    SerializeStringArrayProperty("extensionsRequired",
                                 model->extensionsRequired, o);
  }

  // MATERIALS
  if (model->materials.size()) {
    detail::json materials;
    detail::JsonReserveArray(materials, model->materials.size());
    for (unsigned int i = 0; i < model->materials.size(); ++i) {
      detail::json material;
      SerializeGltfMaterial(model->materials[i], material);

      if (detail::JsonIsNull(material)) {
        // Issue 294.
        // `material` does not have any required parameters
        // so the result may be null(unmodified) when all material parameters
        // have default value.
        //
        // null is not allowed thus we create an empty JSON object.
        detail::JsonSetObject(material);
      }
      detail::JsonPushBack(materials, std::move(material));
    }
    detail::JsonAddMember(o, "materials", std::move(materials));
  }

  // MESHES
  if (model->meshes.size()) {
    detail::json meshes;
    detail::JsonReserveArray(meshes, model->meshes.size());
    for (unsigned int i = 0; i < model->meshes.size(); ++i) {
      detail::json mesh;
      SerializeGltfMesh(model->meshes[i], mesh);
      detail::JsonPushBack(meshes, std::move(mesh));
    }
    detail::JsonAddMember(o, "meshes", std::move(meshes));
  }

  // NODES
  if (model->nodes.size()) {
    detail::json nodes;
    detail::JsonReserveArray(nodes, model->nodes.size());
    for (unsigned int i = 0; i < model->nodes.size(); ++i) {
      detail::json node;
      SerializeGltfNode(model->nodes[i], node);

      if (detail::JsonIsNull(node)) {
        // Issue 457.
        // `node` does not have any required parameters,
        // so the result may be null(unmodified) when all node parameters
        // have default value.
        //
        // null is not allowed thus we create an empty JSON object.
        detail::JsonSetObject(node);
      }
      detail::JsonPushBack(nodes, std::move(node));
    }
    detail::JsonAddMember(o, "nodes", std::move(nodes));
  }

  // SCENE
  if (model->defaultScene > -1) {
    SerializeNumberProperty<int>("scene", model->defaultScene, o);
  }

  // SCENES
  if (model->scenes.size()) {
    detail::json scenes;
    detail::JsonReserveArray(scenes, model->scenes.size());
    for (unsigned int i = 0; i < model->scenes.size(); ++i) {
      detail::json currentScene;
      SerializeGltfScene(model->scenes[i], currentScene);
      if (detail::JsonIsNull(currentScene)) {
        // Issue 464.
        // `scene` does not have any required parameters,
        // so the result may be null(unmodified) when all scene parameters
        // have default value.
        //
        // null is not allowed thus we create an empty JSON object.
        detail::JsonSetObject(currentScene);
      }
      detail::JsonPushBack(scenes, std::move(currentScene));
    }
    detail::JsonAddMember(o, "scenes", std::move(scenes));
  }

  // SKINS
  if (model->skins.size()) {
    detail::json skins;
    detail::JsonReserveArray(skins, model->skins.size());
    for (unsigned int i = 0; i < model->skins.size(); ++i) {
      detail::json skin;
      SerializeGltfSkin(model->skins[i], skin);
      detail::JsonPushBack(skins, std::move(skin));
    }
    detail::JsonAddMember(o, "skins", std::move(skins));
  }

  // TEXTURES
  if (model->textures.size()) {
    detail::json textures;
    detail::JsonReserveArray(textures, model->textures.size());
    for (unsigned int i = 0; i < model->textures.size(); ++i) {
      detail::json texture;
      SerializeGltfTexture(model->textures[i], texture);
      detail::JsonPushBack(textures, std::move(texture));
    }
    detail::JsonAddMember(o, "textures", std::move(textures));
  }

  // SAMPLERS
  if (model->samplers.size()) {
    detail::json samplers;
    detail::JsonReserveArray(samplers, model->samplers.size());
    for (unsigned int i = 0; i < model->samplers.size(); ++i) {
      detail::json sampler;
      SerializeGltfSampler(model->samplers[i], sampler);
      detail::JsonPushBack(samplers, std::move(sampler));
    }
    detail::JsonAddMember(o, "samplers", std::move(samplers));
  }

  // CAMERAS
  if (model->cameras.size()) {
    detail::json cameras;
    detail::JsonReserveArray(cameras, model->cameras.size());
    for (unsigned int i = 0; i < model->cameras.size(); ++i) {
      detail::json camera;
      SerializeGltfCamera(model->cameras[i], camera);
      detail::JsonPushBack(cameras, std::move(camera));
    }
    detail::JsonAddMember(o, "cameras", std::move(cameras));
  }

  // EXTRAS & EXTENSIONS
  SerializeExtrasAndExtensions(*model, o);

  auto extensionsUsed = model->extensionsUsed;

  // LIGHTS as KHR_lights_punctual
  if (model->lights.size()) {
    detail::json lights;
    detail::JsonReserveArray(lights, model->lights.size());
    for (unsigned int i = 0; i < model->lights.size(); ++i) {
      detail::json light;
      SerializeGltfLight(model->lights[i], light);
      detail::JsonPushBack(lights, std::move(light));
    }
    detail::json khr_lights_cmn;
    detail::JsonAddMember(khr_lights_cmn, "lights", std::move(lights));
    detail::json ext_j;

    {
      detail::json_const_iterator it;
      if (detail::FindMember(o, "extensions", it)) {
        detail::JsonAssign(ext_j, detail::GetValue(it));
      }
    }

    detail::JsonAddMember(ext_j, "KHR_lights_punctual",
                          std::move(khr_lights_cmn));

    detail::JsonAddMember(o, "extensions", std::move(ext_j));

    // Also add "KHR_lights_punctual" to `extensionsUsed`
    {
      auto has_khr_lights_punctual =
          std::find_if(extensionsUsed.begin(), extensionsUsed.end(),
                       [](const std::string &s) {
                         return (s.compare("KHR_lights_punctual") == 0);
                       });

      if (has_khr_lights_punctual == extensionsUsed.end()) {
        extensionsUsed.push_back("KHR_lights_punctual");
      }
    }
  }

  // KHR_audio
  if (!model->audioEmitters.empty() || !model->audioSources.empty()) {
    detail::json emitters;
    detail::JsonReserveArray(emitters, model->audioEmitters.size());
    for (unsigned int i = 0; i < model->audioEmitters.size(); ++i) {
      detail::json emitter;
      SerializeGltfAudioEmitter(model->audioEmitters[i], emitter);
      detail::JsonPushBack(emitters, std::move(emitter));
    }
    detail::json khr_audio_cmn;
    detail::JsonAddMember(khr_audio_cmn, "emitters", std::move(emitters));

    detail::json sources;
    detail::JsonReserveArray(sources, model->audioSources.size());
    for (unsigned int i = 0; i < model->audioSources.size(); ++i) {
      detail::json source;
      SerializeGltfAudioSource(model->audioSources[i], source);
      detail::JsonPushBack(sources, std::move(source));
    }
    detail::JsonAddMember(khr_audio_cmn, "sources", std::move(sources));

    detail::json ext_j;
    {
      detail::json_const_iterator it;
      if (detail::FindMember(o, "extensions", it)) {
        detail::JsonAssign(ext_j, detail::GetValue(it));
      }
    }

    detail::JsonAddMember(ext_j, "KHR_audio", std::move(khr_audio_cmn));

    detail::JsonAddMember(o, "extensions", std::move(ext_j));

    // Also add "KHR_audio" to `extensionsUsed`
    {
      auto has_khr_audio = std::find_if(
          extensionsUsed.begin(), extensionsUsed.end(),
          [](const std::string &s) { return (s.compare("KHR_audio") == 0); });

      if (has_khr_audio == extensionsUsed.end()) {
        extensionsUsed.push_back("KHR_audio");
      }
    }
  }

  // MSFT_lod

  // Look if there is a node that employs MSFT_lod
  auto msft_lod_nodes_it = std::find_if(
    model->nodes.begin(), model->nodes.end(),
    [](const Node& node) { return !node.lods.empty(); });

  // Look if there is a material that employs MSFT_lod
  auto msft_lod_materials_it = std::find_if(
    model->materials.begin(), model->materials.end(),
    [](const Material& material) {return !material.lods.empty(); });

  // If either a node or a material employ MSFT_lod, then we need
  // to add MSFT_lod to the list of used extensions.
  if (msft_lod_nodes_it != model->nodes.end() || msft_lod_materials_it != model->materials.end()) {
    // First check if MSFT_lod is already registered as used extension
    auto has_msft_lod = std::find_if(
      extensionsUsed.begin(), extensionsUsed.end(),
      [](const std::string &s) { return (s.compare("MSFT_lod") == 0); });

    // If MSFT_lod is not registered yet, add it
    if (has_msft_lod == extensionsUsed.end()) {
      extensionsUsed.push_back("MSFT_lod");
    }
  }

  // Extensions used
  if (extensionsUsed.size()) {
    SerializeStringArrayProperty("extensionsUsed", extensionsUsed, o);
  }
}